

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<8,_8,_1,_true,_embree::avx::ArrayIntersectorK_1<8,_embree::avx::QuadMiIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RayK<8> *pRVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  float *pfVar5;
  Geometry *pGVar6;
  RTCRayQueryContext *pRVar7;
  RTCFilterFunctionN p_Var8;
  size_t k;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [28];
  undefined1 auVar97 [28];
  int iVar98;
  long lVar99;
  undefined1 (*pauVar100) [32];
  ulong uVar101;
  ulong uVar102;
  ulong *puVar103;
  NodeRef root;
  undefined4 uVar104;
  ulong unaff_R15;
  ulong uVar105;
  bool bVar106;
  float fVar122;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  undefined1 in_ZMM0 [64];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar123;
  undefined1 auVar124 [16];
  float fVar146;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [64];
  float fVar147;
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  undefined1 auVar156 [64];
  float fVar163;
  float fVar164;
  float fVar170;
  float fVar172;
  float fVar173;
  float fVar175;
  float fVar177;
  float fVar179;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  float fVar171;
  float fVar174;
  float fVar176;
  float fVar178;
  float fVar180;
  float fVar181;
  undefined1 auVar169 [32];
  float fVar182;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar200;
  float fVar204;
  float fVar207;
  float fVar210;
  float fVar213;
  float fVar216;
  undefined1 auVar198 [32];
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar205;
  float fVar206;
  float fVar208;
  float fVar209;
  float fVar211;
  float fVar212;
  float fVar214;
  float fVar215;
  float fVar217;
  float fVar218;
  float fVar219;
  undefined1 auVar199 [32];
  float fVar220;
  undefined1 auVar221 [32];
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  undefined1 auVar222 [64];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  float fVar231;
  float fVar232;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar236 [64];
  float fVar243;
  float fVar244;
  float fVar247;
  float fVar249;
  float fVar251;
  float fVar253;
  float fVar255;
  float fVar257;
  float fVar259;
  undefined1 auVar245 [32];
  float fVar248;
  float fVar250;
  float fVar252;
  float fVar254;
  float fVar256;
  float fVar258;
  undefined1 auVar246 [32];
  float fVar264;
  float fVar265;
  float fVar266;
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar263 [64];
  float fVar267;
  undefined1 auVar268 [32];
  float fVar270;
  undefined1 auVar269 [64];
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar291;
  float fVar292;
  float fVar293;
  undefined1 auVar281 [32];
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar301;
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  vbool<8> terminated;
  TravRayK<8,_true> tray;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_5f79;
  ulong local_5f78;
  ulong local_5f70;
  RayQueryContext *local_5f68;
  undefined1 local_5f60 [8];
  float fStack_5f58;
  float fStack_5f54;
  float fStack_5f50;
  float fStack_5f4c;
  float fStack_5f48;
  float fStack_5f44;
  RayK<8> *local_5f28;
  undefined1 local_5f20 [32];
  undefined1 local_5f00 [40];
  undefined1 (*local_5ed8) [32];
  RTCFilterFunctionNArguments local_5ed0;
  undefined1 local_5ea0 [8];
  float fStack_5e98;
  float fStack_5e94;
  float fStack_5e90;
  float fStack_5e8c;
  float fStack_5e88;
  float fStack_5e84;
  undefined1 local_5e80 [8];
  float fStack_5e78;
  float fStack_5e74;
  float fStack_5e70;
  float fStack_5e6c;
  float fStack_5e68;
  undefined1 local_5e60 [20];
  uint uStack_5e4c;
  uint uStack_5e48;
  uint uStack_5e44;
  BVH *local_5e40;
  Intersectors *local_5e38;
  ulong local_5e30;
  Scene *local_5e28;
  undefined1 local_5e20 [32];
  undefined1 local_5e00 [32];
  undefined1 local_5de0 [32];
  undefined1 local_5dc0 [32];
  undefined1 local_5da0 [32];
  undefined1 local_5d80 [32];
  undefined1 local_5d60 [32];
  undefined1 local_5d40 [32];
  undefined1 local_5d20 [8];
  float fStack_5d18;
  float fStack_5d14;
  float fStack_5d10;
  float fStack_5d0c;
  float fStack_5d08;
  undefined1 local_5d00 [32];
  undefined1 local_5ce0 [32];
  undefined1 local_5cc0 [32];
  undefined1 local_5ca0 [32];
  undefined1 local_5c80 [32];
  undefined1 local_5c60 [32];
  RTCHitN local_5c40 [32];
  undefined1 local_5c20 [32];
  undefined1 local_5c00 [32];
  undefined1 local_5be0 [32];
  undefined1 local_5bc0 [32];
  undefined1 local_5ba0 [16];
  undefined1 local_5b90 [16];
  undefined1 local_5b80 [16];
  undefined1 local_5b70 [16];
  uint local_5b60;
  uint uStack_5b5c;
  uint uStack_5b58;
  uint uStack_5b54;
  uint uStack_5b50;
  uint uStack_5b4c;
  uint uStack_5b48;
  uint uStack_5b44;
  uint local_5b40;
  uint uStack_5b3c;
  uint uStack_5b38;
  uint uStack_5b34;
  uint uStack_5b30;
  uint uStack_5b2c;
  uint uStack_5b28;
  uint uStack_5b24;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5b20;
  undefined1 local_5ac0 [32];
  undefined1 local_5aa0 [32];
  undefined1 local_5a80 [32];
  undefined1 local_5a60 [8];
  float fStack_5a58;
  float fStack_5a54;
  float fStack_5a50;
  float fStack_5a4c;
  float fStack_5a48;
  undefined1 local_5a40 [8];
  float fStack_5a38;
  float fStack_5a34;
  float fStack_5a30;
  float fStack_5a2c;
  float fStack_5a28;
  undefined1 local_5a20 [32];
  undefined1 local_5a00 [32];
  undefined1 local_59e0 [32];
  undefined1 local_59c0 [32];
  undefined1 local_59a0 [32];
  undefined1 local_5980 [32];
  undefined1 local_5960 [32];
  undefined8 local_5940;
  undefined8 uStack_5938;
  undefined8 uStack_5930;
  undefined8 uStack_5928;
  undefined8 local_5920;
  undefined8 uStack_5918;
  undefined8 uStack_5910;
  undefined8 uStack_5908;
  undefined1 local_5900 [32];
  undefined1 local_58e0 [32];
  undefined1 local_58c0 [32];
  undefined1 local_58a0 [32];
  float local_5880;
  float fStack_587c;
  float fStack_5878;
  float fStack_5874;
  float fStack_5870;
  float fStack_586c;
  float fStack_5868;
  float fStack_5864;
  float local_5860;
  float fStack_585c;
  float fStack_5858;
  float fStack_5854;
  float fStack_5850;
  float fStack_584c;
  float fStack_5848;
  float fStack_5844;
  undefined1 local_5840 [32];
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  undefined1 auVar235 [64];
  undefined1 auVar262 [64];
  undefined1 auVar271 [36];
  
  local_5e40 = (BVH *)This->ptr;
  local_5808 = (local_5e40->root).ptr;
  if (local_5808 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar125 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
      auVar126 = vpcmpeqd_avx(auVar125,*(undefined1 (*) [16])(valid_i->field_0).field_1.vl);
      auVar125 = vpcmpeqd_avx(auVar125,*(undefined1 (*) [16])((long)&valid_i->field_0 + 0x10));
      auVar124 = ZEXT816(0) << 0x40;
      auVar134 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar124),5);
      auVar165._16_16_ = auVar125;
      auVar165._0_16_ = auVar126;
      auVar127 = auVar165 & auVar134;
      if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar127 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar127 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar127 >> 0x7f,0) != '\0') ||
            (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar127 >> 0xbf,0) != '\0') ||
          (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar127[0x1f] < '\0') {
        local_5960 = vandps_avx(auVar134,auVar165);
        local_5b20._0_8_ = *(undefined8 *)ray;
        local_5b20._8_8_ = *(undefined8 *)(ray + 8);
        local_5b20._16_8_ = *(undefined8 *)(ray + 0x10);
        local_5b20._24_8_ = *(undefined8 *)(ray + 0x18);
        local_5b20._32_8_ = *(undefined8 *)(ray + 0x20);
        local_5b20._40_8_ = *(undefined8 *)(ray + 0x28);
        local_5b20._48_8_ = *(undefined8 *)(ray + 0x30);
        local_5b20._56_8_ = *(undefined8 *)(ray + 0x38);
        local_5b20._64_8_ = *(undefined8 *)(ray + 0x40);
        local_5b20._72_8_ = *(undefined8 *)(ray + 0x48);
        local_5b20._80_8_ = *(undefined8 *)(ray + 0x50);
        local_5b20._88_8_ = *(undefined8 *)(ray + 0x58);
        local_5ac0 = *(undefined1 (*) [32])(ray + 0x80);
        local_5aa0 = *(undefined1 (*) [32])(ray + 0xa0);
        local_5a80 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar233._8_4_ = 0x7fffffff;
        auVar233._0_8_ = 0x7fffffff7fffffff;
        auVar233._12_4_ = 0x7fffffff;
        auVar233._16_4_ = 0x7fffffff;
        auVar233._20_4_ = 0x7fffffff;
        auVar233._24_4_ = 0x7fffffff;
        auVar233._28_4_ = 0x7fffffff;
        auVar260._8_4_ = 0x219392ef;
        auVar260._0_8_ = 0x219392ef219392ef;
        auVar260._12_4_ = 0x219392ef;
        auVar260._16_4_ = 0x219392ef;
        auVar260._20_4_ = 0x219392ef;
        auVar260._24_4_ = 0x219392ef;
        auVar260._28_4_ = 0x219392ef;
        auVar262 = ZEXT3264(auVar260);
        auVar229._8_4_ = 0x3f800000;
        auVar229._0_8_ = 0x3f8000003f800000;
        auVar229._12_4_ = 0x3f800000;
        auVar229._16_4_ = 0x3f800000;
        auVar229._20_4_ = 0x3f800000;
        auVar229._24_4_ = 0x3f800000;
        auVar229._28_4_ = 0x3f800000;
        auVar134 = vandps_avx(auVar233,local_5ac0);
        auVar166 = vdivps_avx(auVar229,local_5ac0);
        auVar127 = vcmpps_avx(auVar134,auVar260,1);
        auVar167 = vdivps_avx(auVar229,local_5aa0);
        auVar222 = ZEXT3264(auVar167);
        auVar134 = vandps_avx(auVar233,local_5aa0);
        auVar183 = vdivps_avx(auVar229,local_5a80);
        auVar165 = vcmpps_avx(auVar134,auVar260,1);
        auVar134 = vandps_avx(auVar233,local_5a80);
        auVar234._8_4_ = 0x5d5e0b6b;
        auVar234._0_8_ = 0x5d5e0b6b5d5e0b6b;
        auVar234._12_4_ = 0x5d5e0b6b;
        auVar234._16_4_ = 0x5d5e0b6b;
        auVar234._20_4_ = 0x5d5e0b6b;
        auVar234._24_4_ = 0x5d5e0b6b;
        auVar234._28_4_ = 0x5d5e0b6b;
        auVar235 = ZEXT3264(auVar234);
        _local_5a60 = vblendvps_avx(auVar166,auVar234,auVar127);
        _local_5a40 = vblendvps_avx(auVar167,auVar234,auVar165);
        auVar134 = vcmpps_avx(auVar134,auVar260,1);
        local_5a20 = vblendvps_avx(auVar183,auVar234,auVar134);
        auVar127._8_4_ = 0x20;
        auVar127._0_8_ = 0x2000000020;
        auVar127._12_4_ = 0x20;
        auVar127._16_4_ = 0x20;
        auVar127._20_4_ = 0x20;
        auVar127._24_4_ = 0x20;
        auVar127._28_4_ = 0x20;
        auVar134 = vcmpps_avx(_local_5a60,ZEXT1632(auVar124),1);
        local_5a00 = vandps_avx(auVar134,auVar127);
        auVar127 = ZEXT1632(auVar124);
        auVar134 = vcmpps_avx(_local_5a40,auVar127,5);
        auVar166._8_4_ = 0x40;
        auVar166._0_8_ = 0x4000000040;
        auVar166._12_4_ = 0x40;
        auVar166._16_4_ = 0x40;
        auVar166._20_4_ = 0x40;
        auVar166._24_4_ = 0x40;
        auVar166._28_4_ = 0x40;
        auVar198._8_4_ = 0x60;
        auVar198._0_8_ = 0x6000000060;
        auVar198._12_4_ = 0x60;
        auVar198._16_4_ = 0x60;
        auVar198._20_4_ = 0x60;
        auVar198._24_4_ = 0x60;
        auVar198._28_4_ = 0x60;
        local_59e0 = vblendvps_avx(auVar198,auVar166,auVar134);
        auVar134 = vcmpps_avx(local_5a20,auVar127,5);
        auVar167._8_4_ = 0x80;
        auVar167._0_8_ = 0x8000000080;
        auVar167._12_4_ = 0x80;
        auVar167._16_4_ = 0x80;
        auVar167._20_4_ = 0x80;
        auVar167._24_4_ = 0x80;
        auVar167._28_4_ = 0x80;
        auVar183._8_4_ = 0xa0;
        auVar183._0_8_ = 0xa0000000a0;
        auVar183._12_4_ = 0xa0;
        auVar183._16_4_ = 0xa0;
        auVar183._20_4_ = 0xa0;
        auVar183._24_4_ = 0xa0;
        auVar183._28_4_ = 0xa0;
        local_59c0 = vblendvps_avx(auVar183,auVar167,auVar134);
        auVar134 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar127);
        auVar127 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar127);
        local_4680._8_4_ = 0x7f800000;
        local_4680._0_8_ = 0x7f8000007f800000;
        local_4680._12_4_ = 0x7f800000;
        local_4680._16_4_ = 0x7f800000;
        local_4680._20_4_ = 0x7f800000;
        local_4680._24_4_ = 0x7f800000;
        local_4680._28_4_ = 0x7f800000;
        auVar269 = ZEXT3264(local_4680);
        local_59a0 = vblendvps_avx(local_4680,auVar134,local_5960);
        auVar134._8_4_ = 0xff800000;
        auVar134._0_8_ = 0xff800000ff800000;
        auVar134._12_4_ = 0xff800000;
        auVar134._16_4_ = 0xff800000;
        auVar134._20_4_ = 0xff800000;
        auVar134._24_4_ = 0xff800000;
        auVar134._28_4_ = 0xff800000;
        auVar156 = ZEXT3264(auVar134);
        local_5980 = vblendvps_avx(auVar134,auVar127,local_5960);
        auVar134 = vcmpps_avx(local_5980,local_5980,0xf);
        local_5e60._4_4_ = local_5960._4_4_ ^ auVar134._4_4_;
        local_5e60._0_4_ = local_5960._0_4_ ^ auVar134._0_4_;
        local_5e60._8_4_ = local_5960._8_4_ ^ auVar134._8_4_;
        local_5e60._12_4_ = local_5960._12_4_ ^ auVar134._12_4_;
        local_5e60._16_4_ = local_5960._16_4_ ^ auVar134._16_4_;
        uStack_5e4c = local_5960._20_4_ ^ auVar134._20_4_;
        uStack_5e48 = local_5960._24_4_ ^ auVar134._24_4_;
        uStack_5e44 = local_5960._28_4_ ^ auVar134._28_4_;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar102 = 7;
        }
        else {
          uVar102 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        local_5f28 = ray + 0x100;
        puVar103 = local_5800;
        local_5810 = 0xfffffffffffffff8;
        pauVar100 = (undefined1 (*) [32])local_4640;
        local_5920 = mm_lookupmask_ps._16_8_;
        uStack_5918 = mm_lookupmask_ps._24_8_;
        uStack_5910 = mm_lookupmask_ps._16_8_;
        uStack_5908 = mm_lookupmask_ps._24_8_;
        local_4660 = local_59a0;
        local_5940 = mm_lookupmask_pd._0_8_;
        uStack_5938 = mm_lookupmask_pd._8_8_;
        uStack_5930 = mm_lookupmask_pd._0_8_;
        uStack_5928 = mm_lookupmask_pd._8_8_;
        local_5ed8 = (undefined1 (*) [32])&local_5b60;
        local_5f70 = uVar102;
        local_5f68 = context;
        local_5e38 = This;
LAB_00436087:
        do {
          do {
            auVar125 = auVar156._0_16_;
            root.ptr = puVar103[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_00437561;
            puVar103 = puVar103 + -1;
            pauVar100 = pauVar100 + -1;
            _local_5f60 = *pauVar100;
            auVar145 = ZEXT3264(_local_5f60);
            auVar134 = vcmpps_avx(_local_5f60,local_5980,1);
          } while ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                        (auVar134 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar134 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      SUB321(auVar134 >> 0x7f,0) == '\0') &&
                     (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    SUB321(auVar134 >> 0xbf,0) == '\0') &&
                   (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   -1 < auVar134[0x1f]);
          uVar104 = vmovmskps_avx(auVar134);
          unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),uVar104);
          if (uVar102 < (uint)POPCOUNT(uVar104)) {
LAB_004360c5:
            do {
              iVar98 = 4;
              uVar101 = 8;
              auVar125 = auVar156._0_16_;
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_00437561;
                auVar134 = vcmpps_avx(local_5980,auVar145._0_32_,6);
                if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar134 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar134 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar134 >> 0x7f,0) == '\0') &&
                      (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar134 >> 0xbf,0) == '\0') &&
                    (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar134[0x1f]) goto LAB_00436087;
                local_5e30 = (ulong)((uint)root.ptr & 0xf) - 8;
                auVar116 = _local_5e60;
                if (local_5e30 == 0) goto LAB_0043740e;
                auVar135._0_8_ = local_5e60._0_8_ ^ 0xffffffffffffffff;
                auVar135._8_4_ = local_5e60._8_4_ ^ 0xffffffff;
                auVar135._12_4_ = local_5e60._12_4_ ^ 0xffffffff;
                auVar135._16_4_ = local_5e60._16_4_ ^ 0xffffffff;
                auVar135._20_4_ = local_5e60._20_4_ ^ 0xffffffff;
                auVar135._24_4_ = local_5e60._24_4_ ^ 0xffffffff;
                auVar135._28_4_ = local_5e60._28_4_ ^ 0xffffffff;
                lVar99 = (root.ptr & 0xfffffffffffffff0) + 0x50;
                uVar101 = 0;
                goto LAB_004362b8;
              }
              lVar99 = 0;
              auVar134 = auVar269._0_32_;
              do {
                uVar105 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar99 * 8);
                if (uVar105 == 8) {
                  auVar145 = ZEXT3264(auVar134);
                  break;
                }
                uVar104 = *(undefined4 *)(root.ptr + 0x40 + lVar99 * 4);
                auVar128._4_4_ = uVar104;
                auVar128._0_4_ = uVar104;
                auVar128._8_4_ = uVar104;
                auVar128._12_4_ = uVar104;
                auVar128._16_4_ = uVar104;
                auVar128._20_4_ = uVar104;
                auVar128._24_4_ = uVar104;
                auVar128._28_4_ = uVar104;
                auVar89._8_8_ = local_5b20._8_8_;
                auVar89._0_8_ = local_5b20._0_8_;
                auVar89._16_8_ = local_5b20._16_8_;
                auVar89._24_8_ = local_5b20._24_8_;
                auVar90._8_8_ = local_5b20._40_8_;
                auVar90._0_8_ = local_5b20._32_8_;
                auVar90._16_8_ = local_5b20._48_8_;
                auVar90._24_8_ = local_5b20._56_8_;
                auVar91._8_8_ = local_5b20._72_8_;
                auVar91._0_8_ = local_5b20._64_8_;
                auVar91._16_8_ = local_5b20._80_8_;
                auVar91._24_8_ = local_5b20._88_8_;
                auVar127 = vsubps_avx(auVar128,auVar89);
                auVar145._0_4_ = (float)local_5a60._0_4_ * auVar127._0_4_;
                auVar145._4_4_ = (float)local_5a60._4_4_ * auVar127._4_4_;
                auVar145._8_4_ = fStack_5a58 * auVar127._8_4_;
                auVar145._12_4_ = fStack_5a54 * auVar127._12_4_;
                auVar145._16_4_ = fStack_5a50 * auVar127._16_4_;
                auVar145._20_4_ = fStack_5a4c * auVar127._20_4_;
                auVar145._28_36_ = auVar222._28_36_;
                auVar145._24_4_ = fStack_5a48 * auVar127._24_4_;
                auVar166 = auVar145._0_32_;
                auVar222 = ZEXT3264(auVar166);
                uVar104 = *(undefined4 *)(root.ptr + 0x80 + lVar99 * 4);
                auVar129._4_4_ = uVar104;
                auVar129._0_4_ = uVar104;
                auVar129._8_4_ = uVar104;
                auVar129._12_4_ = uVar104;
                auVar129._16_4_ = uVar104;
                auVar129._20_4_ = uVar104;
                auVar129._24_4_ = uVar104;
                auVar129._28_4_ = uVar104;
                auVar127 = vsubps_avx(auVar129,auVar90);
                auVar236._0_4_ = (float)local_5a40._0_4_ * auVar127._0_4_;
                auVar236._4_4_ = (float)local_5a40._4_4_ * auVar127._4_4_;
                auVar236._8_4_ = fStack_5a38 * auVar127._8_4_;
                auVar236._12_4_ = fStack_5a34 * auVar127._12_4_;
                auVar236._16_4_ = fStack_5a30 * auVar127._16_4_;
                auVar236._20_4_ = fStack_5a2c * auVar127._20_4_;
                auVar236._28_36_ = auVar235._28_36_;
                auVar236._24_4_ = fStack_5a28 * auVar127._24_4_;
                auVar167 = auVar236._0_32_;
                auVar235 = ZEXT3264(auVar167);
                uVar104 = *(undefined4 *)(root.ptr + 0xc0 + lVar99 * 4);
                auVar130._4_4_ = uVar104;
                auVar130._0_4_ = uVar104;
                auVar130._8_4_ = uVar104;
                auVar130._12_4_ = uVar104;
                auVar130._16_4_ = uVar104;
                auVar130._20_4_ = uVar104;
                auVar130._24_4_ = uVar104;
                auVar130._28_4_ = uVar104;
                auVar127 = vsubps_avx(auVar130,auVar91);
                auVar263._0_4_ = local_5a20._0_4_ * auVar127._0_4_;
                auVar263._4_4_ = local_5a20._4_4_ * auVar127._4_4_;
                auVar263._8_4_ = local_5a20._8_4_ * auVar127._8_4_;
                auVar263._12_4_ = local_5a20._12_4_ * auVar127._12_4_;
                auVar263._16_4_ = local_5a20._16_4_ * auVar127._16_4_;
                auVar263._20_4_ = local_5a20._20_4_ * auVar127._20_4_;
                auVar263._28_36_ = auVar262._28_36_;
                auVar263._24_4_ = local_5a20._24_4_ * auVar127._24_4_;
                auVar183 = auVar263._0_32_;
                auVar262 = ZEXT3264(auVar183);
                uVar104 = *(undefined4 *)(root.ptr + 0x60 + lVar99 * 4);
                auVar131._4_4_ = uVar104;
                auVar131._0_4_ = uVar104;
                auVar131._8_4_ = uVar104;
                auVar131._12_4_ = uVar104;
                auVar131._16_4_ = uVar104;
                auVar131._20_4_ = uVar104;
                auVar131._24_4_ = uVar104;
                auVar131._28_4_ = uVar104;
                auVar127 = vsubps_avx(auVar131,auVar89);
                auVar15._4_4_ = (float)local_5a60._4_4_ * auVar127._4_4_;
                auVar15._0_4_ = (float)local_5a60._0_4_ * auVar127._0_4_;
                auVar15._8_4_ = fStack_5a58 * auVar127._8_4_;
                auVar15._12_4_ = fStack_5a54 * auVar127._12_4_;
                auVar15._16_4_ = fStack_5a50 * auVar127._16_4_;
                auVar15._20_4_ = fStack_5a4c * auVar127._20_4_;
                auVar15._24_4_ = fStack_5a48 * auVar127._24_4_;
                auVar15._28_4_ = (int)((ulong)local_5b20._24_8_ >> 0x20);
                uVar104 = *(undefined4 *)(root.ptr + 0xa0 + lVar99 * 4);
                auVar132._4_4_ = uVar104;
                auVar132._0_4_ = uVar104;
                auVar132._8_4_ = uVar104;
                auVar132._12_4_ = uVar104;
                auVar132._16_4_ = uVar104;
                auVar132._20_4_ = uVar104;
                auVar132._24_4_ = uVar104;
                auVar132._28_4_ = uVar104;
                auVar127 = vsubps_avx(auVar132,auVar90);
                auVar16._4_4_ = (float)local_5a40._4_4_ * auVar127._4_4_;
                auVar16._0_4_ = (float)local_5a40._0_4_ * auVar127._0_4_;
                auVar16._8_4_ = fStack_5a38 * auVar127._8_4_;
                auVar16._12_4_ = fStack_5a34 * auVar127._12_4_;
                auVar16._16_4_ = fStack_5a30 * auVar127._16_4_;
                auVar16._20_4_ = fStack_5a2c * auVar127._20_4_;
                auVar16._24_4_ = fStack_5a28 * auVar127._24_4_;
                auVar16._28_4_ = (int)((ulong)local_5b20._56_8_ >> 0x20);
                uVar104 = *(undefined4 *)(root.ptr + 0xe0 + lVar99 * 4);
                auVar133._4_4_ = uVar104;
                auVar133._0_4_ = uVar104;
                auVar133._8_4_ = uVar104;
                auVar133._12_4_ = uVar104;
                auVar133._16_4_ = uVar104;
                auVar133._20_4_ = uVar104;
                auVar133._24_4_ = uVar104;
                auVar133._28_4_ = uVar104;
                auVar127 = vsubps_avx(auVar133,auVar91);
                auVar17._4_4_ = local_5a20._4_4_ * auVar127._4_4_;
                auVar17._0_4_ = local_5a20._0_4_ * auVar127._0_4_;
                auVar17._8_4_ = local_5a20._8_4_ * auVar127._8_4_;
                auVar17._12_4_ = local_5a20._12_4_ * auVar127._12_4_;
                auVar17._16_4_ = local_5a20._16_4_ * auVar127._16_4_;
                auVar17._20_4_ = local_5a20._20_4_ * auVar127._20_4_;
                auVar17._24_4_ = local_5a20._24_4_ * auVar127._24_4_;
                auVar17._28_4_ = (int)((ulong)local_5b20._88_8_ >> 0x20);
                auVar127 = vminps_avx(auVar166,auVar15);
                auVar165 = vminps_avx(auVar167,auVar16);
                auVar127 = vmaxps_avx(auVar127,auVar165);
                auVar165 = vminps_avx(auVar183,auVar17);
                auVar127 = vmaxps_avx(auVar127,auVar165);
                auVar18._4_4_ = auVar127._4_4_ * 0.99999964;
                auVar18._0_4_ = auVar127._0_4_ * 0.99999964;
                auVar18._8_4_ = auVar127._8_4_ * 0.99999964;
                auVar18._12_4_ = auVar127._12_4_ * 0.99999964;
                auVar18._16_4_ = auVar127._16_4_ * 0.99999964;
                auVar18._20_4_ = auVar127._20_4_ * 0.99999964;
                auVar18._24_4_ = auVar127._24_4_ * 0.99999964;
                auVar18._28_4_ = auVar127._28_4_;
                auVar127 = vmaxps_avx(auVar166,auVar15);
                auVar165 = vmaxps_avx(auVar167,auVar16);
                auVar165 = vminps_avx(auVar127,auVar165);
                auVar127 = vmaxps_avx(auVar183,auVar17);
                auVar127 = vminps_avx(auVar165,auVar127);
                auVar19._4_4_ = auVar127._4_4_ * 1.0000004;
                auVar19._0_4_ = auVar127._0_4_ * 1.0000004;
                auVar19._8_4_ = auVar127._8_4_ * 1.0000004;
                auVar19._12_4_ = auVar127._12_4_ * 1.0000004;
                auVar19._16_4_ = auVar127._16_4_ * 1.0000004;
                auVar19._20_4_ = auVar127._20_4_ * 1.0000004;
                auVar19._24_4_ = auVar127._24_4_ * 1.0000004;
                auVar19._28_4_ = auVar127._28_4_;
                auVar127 = vmaxps_avx(auVar18,local_59a0);
                auVar165 = vminps_avx(auVar19,local_5980);
                auVar127 = vcmpps_avx(auVar127,auVar165,2);
                auVar156 = ZEXT3264(auVar127);
                if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar127 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar127 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar127 >> 0x7f,0) == '\0') &&
                      (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar127 >> 0xbf,0) == '\0') &&
                    (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar127[0x1f]) {
                  auVar145 = ZEXT3264(auVar134);
                  uVar105 = uVar101;
                }
                else {
                  auVar127 = vblendvps_avx(auVar269._0_32_,auVar18,auVar127);
                  auVar145 = ZEXT3264(auVar127);
                  if (uVar101 != 8) {
                    *puVar103 = uVar101;
                    puVar103 = puVar103 + 1;
                    *pauVar100 = auVar134;
                    pauVar100 = pauVar100 + 1;
                  }
                }
                uVar101 = uVar105;
                lVar99 = lVar99 + 1;
                auVar134 = auVar145._0_32_;
              } while (lVar99 != 8);
              if (uVar101 == 8) goto LAB_00436254;
              auVar134 = vcmpps_avx(local_5980,auVar145._0_32_,6);
              uVar104 = vmovmskps_avx(auVar134);
              root.ptr = uVar101;
            } while ((byte)uVar102 < (byte)POPCOUNT(uVar104));
            *puVar103 = uVar101;
            puVar103 = puVar103 + 1;
            *pauVar100 = auVar145._0_32_;
            pauVar100 = pauVar100 + 1;
          }
          else {
            for (; unaff_R15 != 0; unaff_R15 = unaff_R15 & unaff_R15 - 1) {
              k = 0;
              if (unaff_R15 != 0) {
                for (; (unaff_R15 >> k & 1) == 0; k = k + 1) {
                }
              }
              local_5f20._0_8_ = k;
              auVar156 = ZEXT1664(auVar156._0_16_);
              auVar222 = ZEXT1664(auVar222._0_16_);
              auVar235 = ZEXT1664(auVar235._0_16_);
              auVar262 = ZEXT1664(auVar262._0_16_);
              bVar106 = occluded1(local_5e38,local_5e40,root,k,&local_5f79,ray,
                                  (TravRayK<8,_true> *)&local_5b20.field_0,context);
              auVar125 = auVar156._0_16_;
              if (bVar106) {
                *(undefined4 *)(local_5e60 + local_5f20._0_8_ * 4) = 0xffffffff;
              }
              auVar269 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              uVar102 = local_5f70;
              context = local_5f68;
            }
            auVar125 = vpcmpeqd_avx(auVar125,auVar125);
            auVar126 = vpcmpgtd_avx(stack0xffffffffffffa1b0,auVar125);
            auVar125 = vpcmpgtd_avx(local_5e60._0_16_,auVar125);
            auVar156 = ZEXT1664(auVar125);
            auVar125 = vpor_avx(auVar125,auVar126);
            iVar98 = 3;
            if ((((auVar125 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar125 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar125 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar125[0xf] < '\0') {
              auVar155._8_4_ = 0xff800000;
              auVar155._0_8_ = 0xff800000ff800000;
              auVar155._12_4_ = 0xff800000;
              auVar155._16_4_ = 0xff800000;
              auVar155._20_4_ = 0xff800000;
              auVar155._24_4_ = 0xff800000;
              auVar155._28_4_ = 0xff800000;
              auVar156 = ZEXT3264(auVar155);
              local_5980 = vblendvps_avx(local_5980,auVar155,_local_5e60);
              iVar98 = 2;
            }
            auVar145 = ZEXT3264(_local_5f60);
            unaff_R15 = 0;
            if ((uint)uVar102 < (uint)POPCOUNT(uVar104)) goto LAB_004360c5;
          }
LAB_00436254:
        } while (iVar98 != 3);
LAB_00437561:
        auVar134 = vandps_avx(local_5960,_local_5e60);
        auVar144._8_4_ = 0xff800000;
        auVar144._0_8_ = 0xff800000ff800000;
        auVar144._12_4_ = 0xff800000;
        auVar144._16_4_ = 0xff800000;
        auVar144._20_4_ = 0xff800000;
        auVar144._24_4_ = 0xff800000;
        auVar144._28_4_ = 0xff800000;
        auVar134 = vmaskmovps_avx(auVar134,auVar144);
        *(undefined1 (*) [32])local_5f28 = auVar134;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    uVar101 = local_5f78 + 1;
    lVar99 = lVar99 + 0x60;
    if (local_5e30 <= uVar101) break;
LAB_004362b8:
    local_5e28 = context->scene;
    uVar105 = 0;
    local_5f78 = uVar101;
    local_5f20 = auVar135;
    local_5e20 = auVar135;
    while (uVar3 = *(uint *)(lVar99 + uVar105 * 4), unaff_R15 = uVar105, uVar3 != 0xffffffff) {
      uVar4 = *(uint *)(lVar99 + -0x10 + uVar105 * 4);
      pfVar5 = (local_5e28->vertices).items[uVar4];
      uVar101 = (ulong)*(uint *)(lVar99 + -0x50 + uVar105 * 4);
      fVar220 = pfVar5[uVar101];
      auVar281._4_4_ = fVar220;
      auVar281._0_4_ = fVar220;
      auVar281._8_4_ = fVar220;
      auVar281._12_4_ = fVar220;
      auVar281._16_4_ = fVar220;
      auVar281._20_4_ = fVar220;
      auVar281._24_4_ = fVar220;
      auVar281._28_4_ = fVar220;
      fVar220 = pfVar5[uVar101 + 1];
      auVar136._4_4_ = fVar220;
      auVar136._0_4_ = fVar220;
      auVar136._8_4_ = fVar220;
      auVar136._12_4_ = fVar220;
      auVar136._16_4_ = fVar220;
      auVar136._20_4_ = fVar220;
      auVar136._24_4_ = fVar220;
      auVar136._28_4_ = fVar220;
      fVar220 = pfVar5[uVar101 + 2];
      auVar148._4_4_ = fVar220;
      auVar148._0_4_ = fVar220;
      auVar148._8_4_ = fVar220;
      auVar148._12_4_ = fVar220;
      auVar148._16_4_ = fVar220;
      auVar148._20_4_ = fVar220;
      auVar148._24_4_ = fVar220;
      auVar148._28_4_ = fVar220;
      uVar101 = (ulong)*(uint *)(lVar99 + -0x20 + uVar105 * 4);
      fVar220 = pfVar5[uVar101];
      local_5d80._4_4_ = fVar220;
      local_5d80._0_4_ = fVar220;
      local_5d80._8_4_ = fVar220;
      local_5d80._12_4_ = fVar220;
      local_5d80._16_4_ = fVar220;
      local_5d80._20_4_ = fVar220;
      local_5d80._24_4_ = fVar220;
      local_5d80._28_4_ = fVar220;
      fVar220 = pfVar5[uVar101 + 1];
      local_5da0._4_4_ = fVar220;
      local_5da0._0_4_ = fVar220;
      local_5da0._8_4_ = fVar220;
      local_5da0._12_4_ = fVar220;
      local_5da0._16_4_ = fVar220;
      local_5da0._20_4_ = fVar220;
      local_5da0._24_4_ = fVar220;
      local_5da0._28_4_ = fVar220;
      fVar220 = pfVar5[uVar101 + 2];
      local_5dc0._4_4_ = fVar220;
      local_5dc0._0_4_ = fVar220;
      local_5dc0._8_4_ = fVar220;
      local_5dc0._12_4_ = fVar220;
      local_5dc0._16_4_ = fVar220;
      local_5dc0._20_4_ = fVar220;
      local_5dc0._24_4_ = fVar220;
      local_5dc0._28_4_ = fVar220;
      auVar134 = *(undefined1 (*) [32])(ray + 0x20);
      auVar127 = *(undefined1 (*) [32])(ray + 0x40);
      local_5c60 = vsubps_avx(auVar136,auVar134);
      local_5c80 = vsubps_avx(auVar148,auVar127);
      auVar166 = vsubps_avx(local_5da0,auVar134);
      auVar167 = vsubps_avx(local_5dc0,auVar127);
      local_5cc0 = vsubps_avx(auVar166,local_5c60);
      local_5ce0 = vsubps_avx(auVar167,local_5c80);
      fVar248 = local_5c60._0_4_;
      fVar220 = fVar248 + auVar166._0_4_;
      fVar250 = local_5c60._4_4_;
      fVar223 = fVar250 + auVar166._4_4_;
      fVar252 = local_5c60._8_4_;
      fVar224 = fVar252 + auVar166._8_4_;
      fVar254 = local_5c60._12_4_;
      fVar225 = fVar254 + auVar166._12_4_;
      fVar256 = local_5c60._16_4_;
      fVar226 = fVar256 + auVar166._16_4_;
      fVar258 = local_5c60._20_4_;
      fVar227 = fVar258 + auVar166._20_4_;
      fVar270 = local_5c60._24_4_;
      fVar228 = fVar270 + auVar166._24_4_;
      fVar196 = auVar166._28_4_;
      fVar9 = local_5c80._0_4_;
      fVar243 = auVar167._0_4_ + fVar9;
      fVar10 = local_5c80._4_4_;
      fVar247 = auVar167._4_4_ + fVar10;
      fVar11 = local_5c80._8_4_;
      fVar249 = auVar167._8_4_ + fVar11;
      fVar12 = local_5c80._12_4_;
      fVar251 = auVar167._12_4_ + fVar12;
      fVar13 = local_5c80._16_4_;
      fVar253 = auVar167._16_4_ + fVar13;
      fVar14 = local_5c80._20_4_;
      fVar255 = auVar167._20_4_ + fVar14;
      fVar146 = local_5c80._24_4_;
      fVar257 = auVar167._24_4_ + fVar146;
      fVar267 = local_5c80._28_4_;
      fVar259 = auVar167._28_4_ + fVar267;
      fVar272 = local_5ce0._0_4_;
      fVar273 = local_5ce0._4_4_;
      auVar20._4_4_ = fVar273 * fVar223;
      auVar20._0_4_ = fVar272 * fVar220;
      fVar274 = local_5ce0._8_4_;
      auVar20._8_4_ = fVar274 * fVar224;
      fVar275 = local_5ce0._12_4_;
      auVar20._12_4_ = fVar275 * fVar225;
      fVar276 = local_5ce0._16_4_;
      auVar20._16_4_ = fVar276 * fVar226;
      fVar277 = local_5ce0._20_4_;
      auVar20._20_4_ = fVar277 * fVar227;
      fVar278 = local_5ce0._24_4_;
      auVar20._24_4_ = fVar278 * fVar228;
      auVar20._28_4_ = fVar196;
      fVar118 = local_5cc0._0_4_;
      auVar156._0_4_ = fVar243 * fVar118;
      fVar119 = local_5cc0._4_4_;
      auVar156._4_4_ = fVar247 * fVar119;
      fVar120 = local_5cc0._8_4_;
      auVar156._8_4_ = fVar249 * fVar120;
      fVar121 = local_5cc0._12_4_;
      auVar156._12_4_ = fVar251 * fVar121;
      fVar122 = local_5cc0._16_4_;
      auVar156._16_4_ = fVar253 * fVar122;
      fVar117 = local_5cc0._20_4_;
      auVar156._20_4_ = fVar255 * fVar117;
      fVar123 = local_5cc0._24_4_;
      auVar156._28_36_ = auVar262._28_36_;
      auVar156._24_4_ = fVar257 * fVar123;
      auVar183 = vsubps_avx(auVar156._0_32_,auVar20);
      auVar165 = *(undefined1 (*) [32])ray;
      local_5ca0 = vsubps_avx(auVar281,auVar165);
      auVar198 = vsubps_avx(local_5d80,auVar165);
      local_5d00 = vsubps_avx(auVar198,local_5ca0);
      fVar189 = local_5d00._0_4_;
      fVar191 = local_5d00._4_4_;
      auVar21._4_4_ = fVar191 * fVar247;
      auVar21._0_4_ = fVar189 * fVar243;
      fVar193 = local_5d00._8_4_;
      auVar21._8_4_ = fVar193 * fVar249;
      fVar203 = local_5d00._12_4_;
      auVar21._12_4_ = fVar203 * fVar251;
      fVar209 = local_5d00._16_4_;
      auVar21._16_4_ = fVar209 * fVar253;
      fVar215 = local_5d00._20_4_;
      auVar21._20_4_ = fVar215 * fVar255;
      fVar231 = local_5d00._24_4_;
      auVar21._24_4_ = fVar231 * fVar257;
      auVar21._28_4_ = fVar259;
      fVar279 = local_5ca0._0_4_;
      fVar243 = fVar279 + auVar198._0_4_;
      fVar282 = local_5ca0._4_4_;
      fVar247 = fVar282 + auVar198._4_4_;
      fVar284 = local_5ca0._8_4_;
      fVar249 = fVar284 + auVar198._8_4_;
      fVar286 = local_5ca0._12_4_;
      fVar251 = fVar286 + auVar198._12_4_;
      fVar288 = local_5ca0._16_4_;
      fVar253 = fVar288 + auVar198._16_4_;
      fVar290 = local_5ca0._20_4_;
      fVar255 = fVar290 + auVar198._20_4_;
      fVar292 = local_5ca0._24_4_;
      fVar257 = fVar292 + auVar198._24_4_;
      auVar22._4_4_ = fVar247 * fVar273;
      auVar22._0_4_ = fVar243 * fVar272;
      auVar22._8_4_ = fVar249 * fVar274;
      auVar22._12_4_ = fVar251 * fVar275;
      auVar22._16_4_ = fVar253 * fVar276;
      auVar22._20_4_ = fVar255 * fVar277;
      auVar22._24_4_ = fVar257 * fVar278;
      auVar22._28_4_ = local_5ce0._28_4_;
      auVar229 = vsubps_avx(auVar22,auVar21);
      auVar23._4_4_ = fVar247 * fVar119;
      auVar23._0_4_ = fVar243 * fVar118;
      auVar23._8_4_ = fVar249 * fVar120;
      auVar23._12_4_ = fVar251 * fVar121;
      auVar23._16_4_ = fVar253 * fVar122;
      auVar23._20_4_ = fVar255 * fVar117;
      auVar23._24_4_ = fVar257 * fVar123;
      auVar23._28_4_ = fVar259;
      auVar24._4_4_ = fVar191 * fVar223;
      auVar24._0_4_ = fVar189 * fVar220;
      auVar24._8_4_ = fVar193 * fVar224;
      auVar24._12_4_ = fVar203 * fVar225;
      auVar24._16_4_ = fVar209 * fVar226;
      auVar24._20_4_ = fVar215 * fVar227;
      auVar24._24_4_ = fVar231 * fVar228;
      auVar24._28_4_ = local_5c60._28_4_ + fVar196;
      auVar233 = vsubps_avx(auVar24,auVar23);
      pRVar1 = ray + 0xc0;
      fVar223 = *(float *)pRVar1;
      fVar224 = *(float *)(ray + 0xc4);
      fVar225 = *(float *)(ray + 200);
      fVar226 = *(float *)(ray + 0xcc);
      fVar227 = *(float *)(ray + 0xd0);
      fVar228 = *(float *)(ray + 0xd4);
      fVar243 = *(float *)(ray + 0xd8);
      auVar97 = *(undefined1 (*) [28])pRVar1;
      _local_5e80 = *(undefined1 (*) [32])pRVar1;
      auVar96 = *(undefined1 (*) [28])(ray + 0xa0);
      uVar101 = (ulong)*(uint *)(lVar99 + -0x40 + uVar105 * 4);
      fVar247 = *(float *)(ray + 0x80);
      fVar249 = *(float *)(ray + 0x84);
      fVar251 = *(float *)(ray + 0x88);
      fVar253 = *(float *)(ray + 0x8c);
      fVar255 = *(float *)(ray + 0x90);
      fVar257 = *(float *)(ray + 0x94);
      fVar202 = *(float *)(ray + 0x98);
      fVar220 = pfVar5[uVar101 + 1];
      local_5de0._4_4_ = fVar220;
      local_5de0._0_4_ = fVar220;
      local_5de0._8_4_ = fVar220;
      local_5de0._12_4_ = fVar220;
      local_5de0._16_4_ = fVar220;
      local_5de0._20_4_ = fVar220;
      local_5de0._24_4_ = fVar220;
      local_5de0._28_4_ = fVar220;
      local_58a0._0_4_ =
           fVar247 * auVar183._0_4_ +
           auVar229._0_4_ * *(float *)(ray + 0xa0) + fVar223 * auVar233._0_4_;
      local_58a0._4_4_ =
           fVar249 * auVar183._4_4_ +
           auVar229._4_4_ * *(float *)(ray + 0xa4) + fVar224 * auVar233._4_4_;
      local_58a0._8_4_ =
           fVar251 * auVar183._8_4_ +
           auVar229._8_4_ * *(float *)(ray + 0xa8) + fVar225 * auVar233._8_4_;
      local_58a0._12_4_ =
           fVar253 * auVar183._12_4_ +
           auVar229._12_4_ * *(float *)(ray + 0xac) + fVar226 * auVar233._12_4_;
      local_58a0._16_4_ =
           fVar255 * auVar183._16_4_ +
           auVar229._16_4_ * *(float *)(ray + 0xb0) + fVar227 * auVar233._16_4_;
      local_58a0._20_4_ =
           fVar257 * auVar183._20_4_ +
           auVar229._20_4_ * *(float *)(ray + 0xb4) + fVar228 * auVar233._20_4_;
      local_58a0._24_4_ =
           fVar202 * auVar183._24_4_ +
           auVar229._24_4_ * *(float *)(ray + 0xb8) + fVar243 * auVar233._24_4_;
      local_58a0._28_4_ = *(float *)(ray + 0xbc) + auVar229._28_4_ + auVar233._28_4_;
      auVar134 = vsubps_avx(local_5de0,auVar134);
      fVar220 = pfVar5[uVar101 + 2];
      local_5e00._4_4_ = fVar220;
      local_5e00._0_4_ = fVar220;
      local_5e00._8_4_ = fVar220;
      local_5e00._12_4_ = fVar220;
      local_5e00._16_4_ = fVar220;
      local_5e00._20_4_ = fVar220;
      local_5e00._24_4_ = fVar220;
      local_5e00._28_4_ = fVar220;
      auVar127 = vsubps_avx(local_5e00,auVar127);
      _local_5d20 = vsubps_avx(local_5c60,auVar134);
      local_5d40 = vsubps_avx(local_5c80,auVar127);
      fVar194 = fVar248 + auVar134._0_4_;
      fVar200 = fVar250 + auVar134._4_4_;
      fVar204 = fVar252 + auVar134._8_4_;
      fVar207 = fVar254 + auVar134._12_4_;
      fVar210 = fVar256 + auVar134._16_4_;
      fVar213 = fVar258 + auVar134._20_4_;
      fVar216 = fVar270 + auVar134._24_4_;
      fVar163 = fVar9 + auVar127._0_4_;
      fVar170 = fVar10 + auVar127._4_4_;
      fVar172 = fVar11 + auVar127._8_4_;
      fVar173 = fVar12 + auVar127._12_4_;
      fVar175 = fVar13 + auVar127._16_4_;
      fVar177 = fVar14 + auVar127._20_4_;
      fVar179 = fVar146 + auVar127._24_4_;
      fVar190 = local_5d40._0_4_;
      fVar192 = local_5d40._4_4_;
      auVar25._4_4_ = fVar192 * fVar200;
      auVar25._0_4_ = fVar190 * fVar194;
      fVar197 = local_5d40._8_4_;
      auVar25._8_4_ = fVar197 * fVar204;
      fVar206 = local_5d40._12_4_;
      auVar25._12_4_ = fVar206 * fVar207;
      fVar212 = local_5d40._16_4_;
      auVar25._16_4_ = fVar212 * fVar210;
      fVar219 = local_5d40._20_4_;
      auVar25._20_4_ = fVar219 * fVar213;
      fVar232 = local_5d40._24_4_;
      auVar25._24_4_ = fVar232 * fVar216;
      auVar25._28_4_ = fVar267;
      fVar174 = local_5d20._0_4_;
      fVar176 = local_5d20._4_4_;
      auVar26._4_4_ = fVar176 * fVar170;
      auVar26._0_4_ = fVar174 * fVar163;
      fVar178 = local_5d20._8_4_;
      auVar26._8_4_ = fVar178 * fVar172;
      fVar180 = local_5d20._12_4_;
      auVar26._12_4_ = fVar180 * fVar173;
      fVar181 = local_5d20._16_4_;
      auVar26._16_4_ = fVar181 * fVar175;
      fVar182 = local_5d20._20_4_;
      auVar26._20_4_ = fVar182 * fVar177;
      fVar188 = local_5d20._24_4_;
      auVar26._24_4_ = fVar188 * fVar179;
      auVar26._28_4_ = fVar259;
      auVar183 = vsubps_avx(auVar26,auVar25);
      fVar220 = pfVar5[uVar101];
      local_5840._4_4_ = fVar220;
      local_5840._0_4_ = fVar220;
      local_5840._8_4_ = fVar220;
      local_5840._12_4_ = fVar220;
      local_5840._16_4_ = fVar220;
      local_5840._20_4_ = fVar220;
      local_5840._24_4_ = fVar220;
      local_5840._28_4_ = fVar220;
      auVar165 = vsubps_avx(local_5840,auVar165);
      local_5d60 = vsubps_avx(local_5ca0,auVar165);
      fVar220 = local_5d60._0_4_;
      fVar259 = local_5d60._4_4_;
      auVar27._4_4_ = fVar259 * fVar170;
      auVar27._0_4_ = fVar220 * fVar163;
      fVar170 = local_5d60._8_4_;
      auVar27._8_4_ = fVar170 * fVar172;
      fVar218 = local_5d60._12_4_;
      auVar27._12_4_ = fVar218 * fVar173;
      fVar264 = local_5d60._16_4_;
      auVar27._16_4_ = fVar264 * fVar175;
      fVar265 = local_5d60._20_4_;
      auVar27._20_4_ = fVar265 * fVar177;
      fVar266 = local_5d60._24_4_;
      auVar27._24_4_ = fVar266 * fVar179;
      auVar27._28_4_ = fVar267 + auVar127._28_4_;
      fVar267 = fVar279 + auVar165._0_4_;
      fVar163 = fVar282 + auVar165._4_4_;
      fVar172 = fVar284 + auVar165._8_4_;
      fVar173 = fVar286 + auVar165._12_4_;
      fVar175 = fVar288 + auVar165._16_4_;
      fVar177 = fVar290 + auVar165._20_4_;
      fVar179 = fVar292 + auVar165._24_4_;
      auVar28._4_4_ = fVar163 * fVar192;
      auVar28._0_4_ = fVar267 * fVar190;
      auVar28._8_4_ = fVar172 * fVar197;
      auVar28._12_4_ = fVar173 * fVar206;
      auVar28._16_4_ = fVar175 * fVar212;
      auVar28._20_4_ = fVar177 * fVar219;
      auVar28._24_4_ = fVar179 * fVar232;
      auVar28._28_4_ = *(undefined4 *)(ray + 0xdc);
      auVar229 = vsubps_avx(auVar28,auVar27);
      auVar29._4_4_ = fVar163 * fVar176;
      auVar29._0_4_ = fVar267 * fVar174;
      auVar29._8_4_ = fVar172 * fVar178;
      auVar29._12_4_ = fVar173 * fVar180;
      auVar29._16_4_ = fVar175 * fVar181;
      auVar29._20_4_ = fVar177 * fVar182;
      auVar29._24_4_ = fVar179 * fVar188;
      auVar29._28_4_ = *(undefined4 *)(ray + 0xdc);
      auVar268._8_4_ = 0x7fffffff;
      auVar268._0_8_ = 0x7fffffff7fffffff;
      auVar268._12_4_ = 0x7fffffff;
      auVar268._16_4_ = 0x7fffffff;
      auVar268._20_4_ = 0x7fffffff;
      auVar268._24_4_ = 0x7fffffff;
      auVar268._28_4_ = 0x7fffffff;
      auVar271 = ZEXT436(0x7fffffff);
      auVar30._4_4_ = fVar259 * fVar200;
      auVar30._0_4_ = fVar220 * fVar194;
      auVar30._8_4_ = fVar170 * fVar204;
      auVar30._12_4_ = fVar218 * fVar207;
      auVar30._16_4_ = fVar264 * fVar210;
      auVar30._20_4_ = fVar265 * fVar213;
      auVar30._24_4_ = fVar266 * fVar216;
      auVar30._28_4_ = local_5d60._28_4_;
      auVar233 = vsubps_avx(auVar30,auVar29);
      fVar280 = auVar96._0_4_;
      fVar283 = auVar96._4_4_;
      fVar285 = auVar96._8_4_;
      fVar287 = auVar96._12_4_;
      fVar289 = auVar96._16_4_;
      fVar291 = auVar96._20_4_;
      fVar293 = auVar96._24_4_;
      auVar184._0_4_ =
           fVar247 * auVar183._0_4_ + fVar223 * auVar233._0_4_ + fVar280 * auVar229._0_4_;
      auVar184._4_4_ =
           fVar249 * auVar183._4_4_ + fVar224 * auVar233._4_4_ + fVar283 * auVar229._4_4_;
      auVar184._8_4_ =
           fVar251 * auVar183._8_4_ + fVar225 * auVar233._8_4_ + fVar285 * auVar229._8_4_;
      auVar184._12_4_ =
           fVar253 * auVar183._12_4_ + fVar226 * auVar233._12_4_ + fVar287 * auVar229._12_4_;
      auVar184._16_4_ =
           fVar255 * auVar183._16_4_ + fVar227 * auVar233._16_4_ + fVar289 * auVar229._16_4_;
      auVar184._20_4_ =
           fVar257 * auVar183._20_4_ + fVar228 * auVar233._20_4_ + fVar291 * auVar229._20_4_;
      auVar184._24_4_ =
           fVar202 * auVar183._24_4_ + fVar243 * auVar233._24_4_ + fVar293 * auVar229._24_4_;
      auVar184._28_4_ = auVar229._28_4_ + auVar233._28_4_ + auVar229._28_4_;
      auVar183 = vsubps_avx(auVar165,auVar198);
      fVar195 = auVar165._0_4_ + auVar198._0_4_;
      fVar201 = auVar165._4_4_ + auVar198._4_4_;
      fVar205 = auVar165._8_4_ + auVar198._8_4_;
      fVar208 = auVar165._12_4_ + auVar198._12_4_;
      fVar211 = auVar165._16_4_ + auVar198._16_4_;
      fVar214 = auVar165._20_4_ + auVar198._20_4_;
      fVar217 = auVar165._24_4_ + auVar198._24_4_;
      auVar229 = vsubps_avx(auVar134,auVar166);
      fVar194 = auVar134._0_4_ + auVar166._0_4_;
      fVar200 = auVar134._4_4_ + auVar166._4_4_;
      fVar204 = auVar134._8_4_ + auVar166._8_4_;
      fVar207 = auVar134._12_4_ + auVar166._12_4_;
      fVar210 = auVar134._16_4_ + auVar166._16_4_;
      fVar213 = auVar134._20_4_ + auVar166._20_4_;
      fVar216 = auVar134._24_4_ + auVar166._24_4_;
      auVar222 = ZEXT3264(auVar167);
      auVar166 = vsubps_avx(auVar127,auVar167);
      auVar262 = ZEXT3264(auVar166);
      fVar147 = auVar127._0_4_ + auVar167._0_4_;
      fVar157 = auVar127._4_4_ + auVar167._4_4_;
      fVar158 = auVar127._8_4_ + auVar167._8_4_;
      fVar159 = auVar127._12_4_ + auVar167._12_4_;
      fVar160 = auVar127._16_4_ + auVar167._16_4_;
      fVar161 = auVar127._20_4_ + auVar167._20_4_;
      fVar162 = auVar127._24_4_ + auVar167._24_4_;
      fVar237 = auVar166._0_4_;
      fVar238 = auVar166._4_4_;
      auVar31._4_4_ = fVar238 * fVar200;
      auVar31._0_4_ = fVar237 * fVar194;
      fVar239 = auVar166._8_4_;
      auVar31._8_4_ = fVar239 * fVar204;
      fVar240 = auVar166._12_4_;
      auVar31._12_4_ = fVar240 * fVar207;
      fVar241 = auVar166._16_4_;
      auVar31._16_4_ = fVar241 * fVar210;
      fVar242 = auVar166._20_4_;
      auVar31._20_4_ = fVar242 * fVar213;
      fVar244 = auVar166._24_4_;
      auVar31._24_4_ = fVar244 * fVar216;
      auVar31._28_4_ = auVar198._28_4_;
      fVar267 = auVar229._0_4_;
      fVar163 = auVar229._4_4_;
      auVar32._4_4_ = fVar163 * fVar157;
      auVar32._0_4_ = fVar267 * fVar147;
      fVar172 = auVar229._8_4_;
      auVar32._8_4_ = fVar172 * fVar158;
      fVar173 = auVar229._12_4_;
      auVar32._12_4_ = fVar173 * fVar159;
      fVar175 = auVar229._16_4_;
      auVar32._16_4_ = fVar175 * fVar160;
      fVar177 = auVar229._20_4_;
      auVar32._20_4_ = fVar177 * fVar161;
      fVar179 = auVar229._24_4_;
      uVar104 = local_5d40._28_4_;
      auVar32._24_4_ = fVar179 * fVar162;
      auVar32._28_4_ = uVar104;
      auVar166 = vsubps_avx(auVar32,auVar31);
      fVar164 = auVar183._0_4_;
      fVar171 = auVar183._4_4_;
      auVar33._4_4_ = fVar171 * fVar157;
      auVar33._0_4_ = fVar164 * fVar147;
      fVar147 = auVar183._8_4_;
      auVar33._8_4_ = fVar147 * fVar158;
      fVar157 = auVar183._12_4_;
      auVar33._12_4_ = fVar157 * fVar159;
      fVar158 = auVar183._16_4_;
      auVar33._16_4_ = fVar158 * fVar160;
      fVar159 = auVar183._20_4_;
      auVar33._20_4_ = fVar159 * fVar161;
      fVar160 = auVar183._24_4_;
      auVar33._24_4_ = fVar160 * fVar162;
      auVar33._28_4_ = auVar127._28_4_ + auVar167._28_4_;
      auVar34._4_4_ = fVar238 * fVar201;
      auVar34._0_4_ = fVar237 * fVar195;
      auVar34._8_4_ = fVar239 * fVar205;
      auVar34._12_4_ = fVar240 * fVar208;
      auVar34._16_4_ = fVar241 * fVar211;
      auVar34._20_4_ = fVar242 * fVar214;
      auVar34._24_4_ = fVar244 * fVar217;
      auVar34._28_4_ = uVar104;
      auVar127 = vsubps_avx(auVar34,auVar33);
      auVar35._4_4_ = fVar201 * fVar163;
      auVar35._0_4_ = fVar195 * fVar267;
      auVar35._8_4_ = fVar205 * fVar172;
      auVar35._12_4_ = fVar208 * fVar173;
      auVar35._16_4_ = fVar211 * fVar175;
      auVar35._20_4_ = fVar214 * fVar177;
      auVar35._24_4_ = fVar217 * fVar179;
      auVar35._28_4_ = auVar165._28_4_ + auVar198._28_4_;
      auVar36._4_4_ = fVar171 * fVar200;
      auVar36._0_4_ = fVar164 * fVar194;
      auVar36._8_4_ = fVar147 * fVar204;
      auVar36._12_4_ = fVar157 * fVar207;
      auVar36._16_4_ = fVar158 * fVar210;
      auVar36._20_4_ = fVar159 * fVar213;
      auVar36._24_4_ = fVar160 * fVar216;
      auVar36._28_4_ = auVar134._28_4_ + fVar196;
      auVar134 = vsubps_avx(auVar36,auVar35);
      auVar137._0_4_ =
           fVar247 * auVar166._0_4_ + fVar223 * auVar134._0_4_ + fVar280 * auVar127._0_4_;
      auVar137._4_4_ =
           fVar249 * auVar166._4_4_ + fVar224 * auVar134._4_4_ + fVar283 * auVar127._4_4_;
      auVar137._8_4_ =
           fVar251 * auVar166._8_4_ + fVar225 * auVar134._8_4_ + fVar285 * auVar127._8_4_;
      auVar137._12_4_ =
           fVar253 * auVar166._12_4_ + fVar226 * auVar134._12_4_ + fVar287 * auVar127._12_4_;
      auVar137._16_4_ =
           fVar255 * auVar166._16_4_ + fVar227 * auVar134._16_4_ + fVar289 * auVar127._16_4_;
      auVar137._20_4_ =
           fVar257 * auVar166._20_4_ + fVar228 * auVar134._20_4_ + fVar291 * auVar127._20_4_;
      auVar137._24_4_ =
           fVar202 * auVar166._24_4_ + fVar243 * auVar134._24_4_ + fVar293 * auVar127._24_4_;
      auVar137._28_4_ = auVar127._28_4_ + auVar134._28_4_ + auVar127._28_4_;
      auVar245._0_4_ = auVar137._0_4_ + local_58a0._0_4_ + auVar184._0_4_;
      auVar245._4_4_ = auVar137._4_4_ + local_58a0._4_4_ + auVar184._4_4_;
      auVar245._8_4_ = auVar137._8_4_ + local_58a0._8_4_ + auVar184._8_4_;
      auVar245._12_4_ = auVar137._12_4_ + local_58a0._12_4_ + auVar184._12_4_;
      auVar245._16_4_ = auVar137._16_4_ + local_58a0._16_4_ + auVar184._16_4_;
      auVar245._20_4_ = auVar137._20_4_ + local_58a0._20_4_ + auVar184._20_4_;
      auVar245._24_4_ = auVar137._24_4_ + local_58a0._24_4_ + auVar184._24_4_;
      auVar245._28_4_ = auVar137._28_4_ + local_58a0._28_4_ + auVar184._28_4_;
      auVar134 = vminps_avx(local_58a0,auVar184);
      auVar127 = vminps_avx(auVar134,auVar137);
      auVar134 = vandps_avx(auVar245,auVar268);
      auVar235 = ZEXT3264(auVar134);
      fVar196 = auVar134._0_4_ * 1.1920929e-07;
      fVar223 = auVar134._4_4_ * 1.1920929e-07;
      auVar37._4_4_ = fVar223;
      auVar37._0_4_ = fVar196;
      fVar224 = auVar134._8_4_ * 1.1920929e-07;
      auVar37._8_4_ = fVar224;
      fVar225 = auVar134._12_4_ * 1.1920929e-07;
      auVar37._12_4_ = fVar225;
      fVar226 = auVar134._16_4_ * 1.1920929e-07;
      auVar37._16_4_ = fVar226;
      fVar227 = auVar134._20_4_ * 1.1920929e-07;
      auVar37._20_4_ = fVar227;
      fVar228 = auVar134._24_4_ * 1.1920929e-07;
      auVar37._24_4_ = fVar228;
      auVar37._28_4_ = 0x34000000;
      auVar230._0_8_ = CONCAT44(fVar223,fVar196) ^ 0x8000000080000000;
      auVar230._8_4_ = -fVar224;
      auVar230._12_4_ = -fVar225;
      auVar230._16_4_ = -fVar226;
      auVar230._20_4_ = -fVar227;
      auVar230._24_4_ = -fVar228;
      auVar230._28_4_ = 0xb4000000;
      auVar127 = vcmpps_avx(auVar127,auVar230,5);
      auVar165 = vmaxps_avx(local_58a0,auVar184);
      auVar165 = vmaxps_avx(auVar165,auVar137);
      auVar165 = vcmpps_avx(auVar165,auVar37,2);
      auVar165 = vorps_avx(auVar127,auVar165);
      uVar101 = (ulong)*(uint *)(lVar99 + -0x30 + uVar105 * 4);
      auVar166 = local_5f20 & auVar165;
      local_5ea0._4_4_ = pfVar5[uVar101];
      local_5ea0._0_4_ = local_5ea0._4_4_;
      fStack_5e98 = (float)local_5ea0._4_4_;
      fStack_5e94 = (float)local_5ea0._4_4_;
      fStack_5e90 = (float)local_5ea0._4_4_;
      fStack_5e8c = (float)local_5ea0._4_4_;
      fStack_5e88 = (float)local_5ea0._4_4_;
      fStack_5e84 = (float)local_5ea0._4_4_;
      local_5860 = pfVar5[uVar101 + 1];
      local_5880 = pfVar5[uVar101 + 2];
      fStack_587c = local_5880;
      fStack_5878 = local_5880;
      fStack_5874 = local_5880;
      fStack_5870 = local_5880;
      fStack_586c = local_5880;
      fStack_5868 = local_5880;
      fStack_5864 = local_5880;
      fStack_585c = local_5860;
      fStack_5858 = local_5860;
      fStack_5854 = local_5860;
      fStack_5850 = local_5860;
      fStack_584c = local_5860;
      fStack_5848 = local_5860;
      fStack_5844 = local_5860;
      if ((((((((auVar166 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar166 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar166 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar166 >> 0x7f,0) != '\0') ||
            (auVar166 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar166 >> 0xbf,0) != '\0') ||
          (auVar166 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar166[0x1f] < '\0') {
        auVar38._4_4_ = fVar176 * fVar273;
        auVar38._0_4_ = fVar174 * fVar272;
        auVar38._8_4_ = fVar178 * fVar274;
        auVar38._12_4_ = fVar180 * fVar275;
        auVar38._16_4_ = fVar181 * fVar276;
        auVar38._20_4_ = fVar182 * fVar277;
        auVar38._24_4_ = fVar188 * fVar278;
        auVar38._28_4_ = local_5880;
        auVar39._4_4_ = fVar119 * fVar192;
        auVar39._0_4_ = fVar118 * fVar190;
        auVar39._8_4_ = fVar120 * fVar197;
        auVar39._12_4_ = fVar121 * fVar206;
        auVar39._16_4_ = fVar122 * fVar212;
        auVar39._20_4_ = fVar117 * fVar219;
        auVar39._24_4_ = fVar123 * fVar232;
        auVar39._28_4_ = auVar127._28_4_;
        auVar198 = vsubps_avx(auVar39,auVar38);
        auVar40._4_4_ = fVar163 * fVar192;
        auVar40._0_4_ = fVar267 * fVar190;
        auVar40._8_4_ = fVar172 * fVar197;
        auVar40._12_4_ = fVar173 * fVar206;
        auVar40._16_4_ = fVar175 * fVar212;
        auVar40._20_4_ = fVar177 * fVar219;
        auVar40._24_4_ = fVar179 * fVar232;
        auVar40._28_4_ = 0x34000000;
        auVar41._4_4_ = fVar176 * fVar238;
        auVar41._0_4_ = fVar174 * fVar237;
        auVar41._8_4_ = fVar178 * fVar239;
        auVar41._12_4_ = fVar180 * fVar240;
        auVar41._16_4_ = fVar181 * fVar241;
        auVar41._20_4_ = fVar182 * fVar242;
        auVar41._24_4_ = fVar188 * fVar244;
        auVar41._28_4_ = auVar134._28_4_;
        auVar167 = vsubps_avx(auVar41,auVar40);
        auVar127 = vandps_avx(auVar268,auVar38);
        auVar166 = vandps_avx(auVar268,auVar40);
        auVar127 = vcmpps_avx(auVar127,auVar166,1);
        auVar167 = vblendvps_avx(auVar167,auVar198,auVar127);
        auVar235 = ZEXT3264(auVar167);
        auVar42._4_4_ = fVar259 * fVar238;
        auVar42._0_4_ = fVar220 * fVar237;
        auVar42._8_4_ = fVar170 * fVar239;
        auVar42._12_4_ = fVar218 * fVar240;
        auVar42._16_4_ = fVar264 * fVar241;
        auVar42._20_4_ = fVar265 * fVar242;
        auVar42._24_4_ = fVar266 * fVar244;
        auVar42._28_4_ = auVar127._28_4_;
        auVar43._4_4_ = fVar259 * fVar273;
        auVar43._0_4_ = fVar220 * fVar272;
        auVar43._8_4_ = fVar170 * fVar274;
        auVar43._12_4_ = fVar218 * fVar275;
        auVar43._16_4_ = fVar264 * fVar276;
        auVar43._20_4_ = fVar265 * fVar277;
        auVar43._24_4_ = fVar266 * fVar278;
        auVar43._28_4_ = auVar198._28_4_;
        auVar262 = ZEXT3264(local_5d00);
        auVar44._4_4_ = fVar191 * fVar192;
        auVar44._0_4_ = fVar189 * fVar190;
        auVar44._8_4_ = fVar193 * fVar197;
        auVar44._12_4_ = fVar203 * fVar206;
        auVar44._16_4_ = fVar209 * fVar212;
        auVar44._20_4_ = fVar215 * fVar219;
        auVar44._24_4_ = fVar231 * fVar232;
        auVar44._28_4_ = auVar166._28_4_;
        auVar233 = vsubps_avx(auVar43,auVar44);
        auVar45._4_4_ = fVar171 * fVar192;
        auVar45._0_4_ = fVar164 * fVar190;
        auVar45._8_4_ = fVar147 * fVar197;
        auVar45._12_4_ = fVar157 * fVar206;
        auVar45._16_4_ = fVar158 * fVar212;
        auVar45._20_4_ = fVar159 * fVar219;
        auVar45._24_4_ = fVar160 * fVar232;
        auVar45._28_4_ = uVar104;
        auVar198 = vsubps_avx(auVar45,auVar42);
        auVar127 = vandps_avx(auVar268,auVar44);
        auVar166 = vandps_avx(auVar268,auVar42);
        auVar127 = vcmpps_avx(auVar127,auVar166,1);
        auVar198 = vblendvps_avx(auVar198,auVar233,auVar127);
        auVar222 = ZEXT3264(auVar198);
        auVar46._4_4_ = fVar176 * fVar171;
        auVar46._0_4_ = fVar174 * fVar164;
        auVar46._8_4_ = fVar178 * fVar147;
        auVar46._12_4_ = fVar180 * fVar157;
        auVar46._16_4_ = fVar181 * fVar158;
        auVar46._20_4_ = fVar182 * fVar159;
        auVar46._24_4_ = fVar188 * fVar160;
        auVar46._28_4_ = auVar127._28_4_;
        auVar47._4_4_ = fVar191 * fVar176;
        auVar47._0_4_ = fVar189 * fVar174;
        auVar47._8_4_ = fVar193 * fVar178;
        auVar47._12_4_ = fVar203 * fVar180;
        auVar47._16_4_ = fVar209 * fVar181;
        auVar47._20_4_ = fVar215 * fVar182;
        auVar47._24_4_ = fVar231 * fVar188;
        auVar47._28_4_ = auVar233._28_4_;
        auVar48._4_4_ = fVar259 * fVar119;
        auVar48._0_4_ = fVar220 * fVar118;
        auVar48._8_4_ = fVar170 * fVar120;
        auVar48._12_4_ = fVar218 * fVar121;
        auVar48._16_4_ = fVar264 * fVar122;
        auVar48._20_4_ = fVar265 * fVar117;
        auVar48._24_4_ = fVar266 * fVar123;
        auVar48._28_4_ = auVar183._28_4_;
        auVar49._4_4_ = fVar259 * fVar163;
        auVar49._0_4_ = fVar220 * fVar267;
        auVar49._8_4_ = fVar170 * fVar172;
        auVar49._12_4_ = fVar218 * fVar173;
        auVar49._16_4_ = fVar264 * fVar175;
        auVar49._20_4_ = fVar265 * fVar177;
        auVar49._24_4_ = fVar266 * fVar179;
        auVar49._28_4_ = auVar229._28_4_;
        auVar229 = vsubps_avx(auVar47,auVar48);
        auVar233 = vsubps_avx(auVar49,auVar46);
        auVar127 = vandps_avx(auVar268,auVar48);
        auVar166 = vandps_avx(auVar268,auVar46);
        auVar183 = vcmpps_avx(auVar127,auVar166,1);
        auVar166 = vblendvps_avx(auVar233,auVar229,auVar183);
        local_5e80._0_4_ = auVar97._0_4_;
        local_5e80._4_4_ = auVar97._4_4_;
        fStack_5e78 = auVar97._8_4_;
        fStack_5e74 = auVar97._12_4_;
        fStack_5e70 = auVar97._16_4_;
        fStack_5e6c = auVar97._20_4_;
        fStack_5e68 = auVar97._24_4_;
        fVar220 = fVar247 * auVar167._0_4_ +
                  auVar166._0_4_ * (float)local_5e80._0_4_ + auVar198._0_4_ * fVar280;
        fVar196 = fVar249 * auVar167._4_4_ +
                  auVar166._4_4_ * (float)local_5e80._4_4_ + auVar198._4_4_ * fVar283;
        fVar267 = fVar251 * auVar167._8_4_ + auVar166._8_4_ * fStack_5e78 + auVar198._8_4_ * fVar285
        ;
        fVar118 = fVar253 * auVar167._12_4_ +
                  auVar166._12_4_ * fStack_5e74 + auVar198._12_4_ * fVar287;
        fVar119 = fVar255 * auVar167._16_4_ +
                  auVar166._16_4_ * fStack_5e70 + auVar198._16_4_ * fVar289;
        fVar120 = fVar257 * auVar167._20_4_ +
                  auVar166._20_4_ * fStack_5e6c + auVar198._20_4_ * fVar291;
        fVar121 = fVar202 * auVar167._24_4_ +
                  auVar166._24_4_ * fStack_5e68 + auVar198._24_4_ * fVar293;
        fVar122 = auVar183._28_4_ + auVar233._28_4_ + auVar183._28_4_;
        auVar107._0_4_ = fVar220 + fVar220;
        auVar107._4_4_ = fVar196 + fVar196;
        auVar107._8_4_ = fVar267 + fVar267;
        auVar107._12_4_ = fVar118 + fVar118;
        auVar107._16_4_ = fVar119 + fVar119;
        auVar107._20_4_ = fVar120 + fVar120;
        auVar107._24_4_ = fVar121 + fVar121;
        auVar107._28_4_ = fVar122 + fVar122;
        fVar196 = auVar167._0_4_ * fVar279 + auVar166._0_4_ * fVar9 + auVar198._0_4_ * fVar248;
        fVar267 = auVar167._4_4_ * fVar282 + auVar166._4_4_ * fVar10 + auVar198._4_4_ * fVar250;
        fVar118 = auVar167._8_4_ * fVar284 + auVar166._8_4_ * fVar11 + auVar198._8_4_ * fVar252;
        fVar119 = auVar167._12_4_ * fVar286 + auVar166._12_4_ * fVar12 + auVar198._12_4_ * fVar254;
        fVar120 = auVar167._16_4_ * fVar288 + auVar166._16_4_ * fVar13 + auVar198._16_4_ * fVar256;
        fVar121 = auVar167._20_4_ * fVar290 + auVar166._20_4_ * fVar14 + auVar198._20_4_ * fVar258;
        fVar146 = auVar167._24_4_ * fVar292 + auVar166._24_4_ * fVar146 + auVar198._24_4_ * fVar270;
        auVar183 = vrcpps_avx(auVar107);
        fVar220 = auVar183._0_4_;
        fVar9 = auVar183._4_4_;
        auVar50._4_4_ = auVar107._4_4_ * fVar9;
        auVar50._0_4_ = auVar107._0_4_ * fVar220;
        fVar10 = auVar183._8_4_;
        auVar50._8_4_ = auVar107._8_4_ * fVar10;
        fVar11 = auVar183._12_4_;
        auVar50._12_4_ = auVar107._12_4_ * fVar11;
        fVar12 = auVar183._16_4_;
        auVar50._16_4_ = auVar107._16_4_ * fVar12;
        fVar13 = auVar183._20_4_;
        auVar50._20_4_ = auVar107._20_4_ * fVar13;
        fVar14 = auVar183._24_4_;
        auVar50._24_4_ = auVar107._24_4_ * fVar14;
        auVar50._28_4_ = auVar127._28_4_;
        auVar185._8_4_ = 0x3f800000;
        auVar185._0_8_ = 0x3f8000003f800000;
        auVar185._12_4_ = 0x3f800000;
        auVar185._16_4_ = 0x3f800000;
        auVar185._20_4_ = 0x3f800000;
        auVar185._24_4_ = 0x3f800000;
        auVar185._28_4_ = 0x3f800000;
        auVar127 = vsubps_avx(auVar185,auVar50);
        auVar51._4_4_ = (fVar267 + fVar267) * (fVar9 + fVar9 * auVar127._4_4_);
        auVar51._0_4_ = (fVar196 + fVar196) * (fVar220 + fVar220 * auVar127._0_4_);
        auVar51._8_4_ = (fVar118 + fVar118) * (fVar10 + fVar10 * auVar127._8_4_);
        auVar51._12_4_ = (fVar119 + fVar119) * (fVar11 + fVar11 * auVar127._12_4_);
        auVar51._16_4_ = (fVar120 + fVar120) * (fVar12 + fVar12 * auVar127._16_4_);
        auVar51._20_4_ = (fVar121 + fVar121) * (fVar13 + fVar13 * auVar127._20_4_);
        auVar51._24_4_ = (fVar146 + fVar146) * (fVar14 + fVar14 * auVar127._24_4_);
        auVar51._28_4_ = auVar183._28_4_ + auVar127._28_4_;
        _local_5f60 = *(undefined1 (*) [32])(ray + 0x100);
        auVar127 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar51,2);
        auVar183 = vcmpps_avx(auVar51,_local_5f60,2);
        auVar127 = vandps_avx(auVar127,auVar183);
        auVar183 = vcmpps_avx(auVar107,_DAT_01faff00,4);
        auVar127 = vandps_avx(auVar183,auVar127);
        auVar125 = vpslld_avx(auVar127._0_16_,0x1f);
        auVar126 = vpsrad_avx(auVar125,0x1f);
        auVar125 = vpslld_avx(auVar127._16_16_,0x1f);
        auVar125 = vpsrad_avx(auVar125,0x1f);
        auVar108._16_16_ = auVar125;
        auVar108._0_16_ = auVar126;
        auVar127 = vandps_avx(auVar165,local_5f20);
        auVar165 = auVar127 & auVar108;
        local_5900 = auVar245;
        local_58e0 = auVar134;
        local_58c0 = auVar184;
        if ((((((((auVar165 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar165 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar165 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar165 >> 0x7f,0) != '\0') ||
              (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar165 >> 0xbf,0) != '\0') ||
            (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar165[0x1f] < '\0') {
          auVar127 = vandps_avx(auVar108,auVar127);
          pGVar6 = (context->scene->geometries).items[uVar4].ptr;
          uVar2 = pGVar6->mask;
          auVar138._4_4_ = uVar2;
          auVar138._0_4_ = uVar2;
          auVar138._8_4_ = uVar2;
          auVar138._12_4_ = uVar2;
          auVar138._16_4_ = uVar2;
          auVar138._20_4_ = uVar2;
          auVar138._24_4_ = uVar2;
          auVar138._28_4_ = uVar2;
          auVar165 = vandps_avx(auVar138,*(undefined1 (*) [32])(ray + 0x120));
          auVar125 = vpcmpeqd_avx(auVar165._16_16_,ZEXT816(0) << 0x20);
          auVar126 = vpcmpeqd_avx(auVar165._0_16_,ZEXT816(0) << 0x20);
          auVar168._16_16_ = auVar125;
          auVar168._0_16_ = auVar127._0_16_;
          auVar165 = vblendps_avx(ZEXT1632(auVar126),auVar168,0xf0);
          auVar183 = auVar127 & ~auVar165;
          if ((((((((auVar183 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar183 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar183 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar183 >> 0x7f,0) != '\0') ||
                (auVar183 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar183 >> 0xbf,0) != '\0') ||
              (auVar183 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar183[0x1f] < '\0') {
            auVar262 = ZEXT3264(auVar167);
            auVar141 = vandnps_avx(auVar165,auVar127);
            auVar125 = auVar141._0_16_;
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (auVar271 = ZEXT436(0x7fffffff), pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)
               ) {
              auVar127 = vrcpps_avx(auVar245);
              fVar220 = auVar127._0_4_;
              fVar9 = auVar127._4_4_;
              auVar83._4_4_ = auVar245._4_4_ * fVar9;
              auVar83._0_4_ = auVar245._0_4_ * fVar220;
              fVar10 = auVar127._8_4_;
              auVar83._8_4_ = auVar245._8_4_ * fVar10;
              fVar11 = auVar127._12_4_;
              auVar83._12_4_ = auVar245._12_4_ * fVar11;
              fVar12 = auVar127._16_4_;
              auVar83._16_4_ = auVar245._16_4_ * fVar12;
              fVar13 = auVar127._20_4_;
              auVar83._20_4_ = auVar245._20_4_ * fVar13;
              fVar14 = auVar127._24_4_;
              auVar83._24_4_ = auVar245._24_4_ * fVar14;
              auVar83._28_4_ = auVar245._28_4_;
              auVar187._8_4_ = 0x3f800000;
              auVar187._0_8_ = 0x3f8000003f800000;
              auVar187._12_4_ = 0x3f800000;
              auVar187._16_4_ = 0x3f800000;
              auVar187._20_4_ = 0x3f800000;
              auVar187._24_4_ = 0x3f800000;
              auVar187._28_4_ = 0x3f800000;
              auVar235 = ZEXT3264(auVar198);
              auVar165 = vsubps_avx(auVar187,auVar83);
              auVar112._0_4_ = fVar220 + fVar220 * auVar165._0_4_;
              auVar112._4_4_ = fVar9 + fVar9 * auVar165._4_4_;
              auVar112._8_4_ = fVar10 + fVar10 * auVar165._8_4_;
              auVar112._12_4_ = fVar11 + fVar11 * auVar165._12_4_;
              auVar112._16_4_ = fVar12 + fVar12 * auVar165._16_4_;
              auVar112._20_4_ = fVar13 + fVar13 * auVar165._20_4_;
              auVar112._24_4_ = fVar14 + fVar14 * auVar165._24_4_;
              auVar112._28_4_ = auVar127._28_4_ + auVar165._28_4_;
              auVar169._8_4_ = 0x219392ef;
              auVar169._0_8_ = 0x219392ef219392ef;
              auVar169._12_4_ = 0x219392ef;
              auVar169._16_4_ = 0x219392ef;
              auVar169._20_4_ = 0x219392ef;
              auVar169._24_4_ = 0x219392ef;
              auVar169._28_4_ = 0x219392ef;
              auVar127 = vcmpps_avx(auVar134,auVar169,5);
              auVar134 = vandps_avx(auVar127,auVar112);
              auVar84._4_4_ = auVar134._4_4_ * local_58a0._4_4_;
              auVar84._0_4_ = auVar134._0_4_ * local_58a0._0_4_;
              auVar84._8_4_ = auVar134._8_4_ * local_58a0._8_4_;
              auVar84._12_4_ = auVar134._12_4_ * local_58a0._12_4_;
              auVar84._16_4_ = auVar134._16_4_ * local_58a0._16_4_;
              auVar84._20_4_ = auVar134._20_4_ * local_58a0._20_4_;
              auVar84._24_4_ = auVar134._24_4_ * local_58a0._24_4_;
              auVar84._28_4_ = auVar127._28_4_;
              auVar127 = vminps_avx(auVar84,auVar187);
              auVar85._4_4_ = auVar134._4_4_ * auVar184._4_4_;
              auVar85._0_4_ = auVar134._0_4_ * auVar184._0_4_;
              auVar85._8_4_ = auVar134._8_4_ * auVar184._8_4_;
              auVar85._12_4_ = auVar134._12_4_ * auVar184._12_4_;
              auVar85._16_4_ = auVar134._16_4_ * auVar184._16_4_;
              auVar85._20_4_ = auVar134._20_4_ * auVar184._20_4_;
              auVar85._24_4_ = auVar134._24_4_ * auVar184._24_4_;
              auVar85._28_4_ = auVar134._28_4_;
              auVar134 = vminps_avx(auVar85,auVar187);
              auVar165 = vsubps_avx(auVar187,auVar127);
              auVar183 = vsubps_avx(auVar187,auVar134);
              auVar93._8_8_ = uStack_5918;
              auVar93._0_8_ = local_5920;
              auVar93._16_8_ = uStack_5910;
              auVar93._24_8_ = uStack_5908;
              local_5be0 = vblendvps_avx(auVar127,auVar165,auVar93);
              local_5bc0 = vblendvps_avx(auVar134,auVar183,auVar93);
              pRVar7 = context->user;
              local_5b80 = vpshufd_avx(ZEXT416(uVar4),0);
              local_5ba0 = vpshufd_avx(ZEXT416(uVar3),0);
              auVar222 = ZEXT1664(local_5ba0);
              auVar127 = vcmpps_avx(ZEXT1632(local_5b80),ZEXT1632(local_5b80),0xf);
              local_5ed8[1] = auVar127;
              *local_5ed8 = auVar127;
              local_5b60 = pRVar7->instID[0];
              local_5b40 = pRVar7->instPrimID[0];
              auVar134 = vblendvps_avx(_local_5f60,auVar51,auVar141);
              *(undefined1 (*) [32])(ray + 0x100) = auVar134;
              local_5ed0.valid = (int *)local_5f00;
              local_5ed0.geometryUserPtr = pGVar6->userPtr;
              local_5ed0.context = context->user;
              local_5ed0.hit = local_5c40;
              local_5ed0.N = 8;
              local_5c40 = (RTCHitN  [32])auVar167;
              local_5c20 = auVar198;
              local_5c00 = auVar166;
              local_5b90 = local_5ba0;
              local_5b70 = local_5b80;
              uStack_5b5c = local_5b60;
              uStack_5b58 = local_5b60;
              uStack_5b54 = local_5b60;
              uStack_5b50 = local_5b60;
              uStack_5b4c = local_5b60;
              uStack_5b48 = local_5b60;
              uStack_5b44 = local_5b60;
              uStack_5b3c = local_5b40;
              uStack_5b38 = local_5b40;
              uStack_5b34 = local_5b40;
              uStack_5b30 = local_5b40;
              uStack_5b2c = local_5b40;
              uStack_5b28 = local_5b40;
              uStack_5b24 = local_5b40;
              if (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0) {
                local_5f00._16_16_ = auVar141._16_16_;
                local_5ed0.ray = (RTCRayN *)ray;
                auVar271 = ZEXT436(0x7fffffff);
              }
              else {
                auVar134 = ZEXT1632(auVar127._0_16_);
                auVar222 = ZEXT1664(local_5ba0);
                auVar235 = ZEXT1664(auVar198._0_16_);
                auVar262 = ZEXT1664(auVar167._0_16_);
                auVar271 = (undefined1  [36])0x0;
                local_5f00._0_32_ = auVar141;
                local_5ed0.ray = (RTCRayN *)ray;
                (*pGVar6->occlusionFilterN)(&local_5ed0);
                auVar127 = vcmpps_avx(auVar134,auVar134,0xf);
                uVar102 = local_5f70;
                context = local_5f68;
                auVar125 = local_5f00._0_16_;
                auVar141 = local_5f00._0_32_;
              }
              local_5f00._0_32_ = auVar141;
              auVar126 = vpcmpeqd_avx(auVar125,ZEXT816(0) << 0x40);
              auVar124 = vpcmpeqd_avx(local_5f00._16_16_,ZEXT816(0) << 0x40);
              auVar151._16_16_ = auVar124;
              auVar151._0_16_ = auVar126;
              auVar134 = auVar127 & ~auVar151;
              if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar134 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar134 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar134 >> 0x7f,0) == '\0') &&
                    (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar134 >> 0xbf,0) == '\0') &&
                  (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar134[0x1f]) {
                auVar141._0_4_ = auVar126._0_4_ ^ auVar127._0_4_;
                auVar141._4_4_ = auVar126._4_4_ ^ auVar127._4_4_;
                auVar141._8_4_ = auVar126._8_4_ ^ auVar127._8_4_;
                auVar141._12_4_ = auVar126._12_4_ ^ auVar127._12_4_;
                auVar141._16_4_ = auVar124._0_4_ ^ auVar127._16_4_;
                auVar141._20_4_ = auVar124._4_4_ ^ auVar127._20_4_;
                auVar141._24_4_ = auVar124._8_4_ ^ auVar127._24_4_;
                auVar141._28_4_ = auVar124._12_4_ ^ auVar127._28_4_;
              }
              else {
                p_Var8 = context->args->filter;
                auVar126 = local_5f00._16_16_;
                if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0))))
                {
                  auVar222 = ZEXT1664(auVar222._0_16_);
                  auVar235 = ZEXT1664(auVar235._0_16_);
                  auVar262 = ZEXT1664(auVar262._0_16_);
                  auVar271 = (undefined1  [36])0x0;
                  (*p_Var8)(&local_5ed0);
                  uVar102 = local_5f70;
                  context = local_5f68;
                  auVar125 = local_5f00._0_16_;
                  auVar126 = local_5f00._16_16_;
                }
                auVar125 = vpcmpeqd_avx(auVar125,ZEXT816(0) << 0x40);
                auVar126 = vpcmpeqd_avx(auVar126,ZEXT816(0) << 0x40);
                auVar114._16_16_ = auVar126;
                auVar114._0_16_ = auVar125;
                auVar141._0_8_ = auVar125._0_8_ ^ 0xffffffffffffffff;
                auVar141._8_4_ = auVar125._8_4_ ^ 0xffffffff;
                auVar141._12_4_ = auVar125._12_4_ ^ 0xffffffff;
                auVar141._16_4_ = auVar126._0_4_ ^ 0xffffffff;
                auVar141._20_4_ = auVar126._4_4_ ^ 0xffffffff;
                auVar141._24_4_ = auVar126._8_4_ ^ 0xffffffff;
                auVar141._28_4_ = auVar126._12_4_ ^ 0xffffffff;
                auVar153._8_4_ = 0xff800000;
                auVar153._0_8_ = 0xff800000ff800000;
                auVar153._12_4_ = 0xff800000;
                auVar153._16_4_ = 0xff800000;
                auVar153._20_4_ = 0xff800000;
                auVar153._24_4_ = 0xff800000;
                auVar153._28_4_ = 0xff800000;
                auVar134 = vblendvps_avx(auVar153,*(undefined1 (*) [32])(local_5ed0.ray + 0x100),
                                         auVar114);
                *(undefined1 (*) [32])(local_5ed0.ray + 0x100) = auVar134;
              }
              auVar134 = vblendvps_avx(_local_5f60,*(undefined1 (*) [32])local_5f28,auVar141);
              *(undefined1 (*) [32])local_5f28 = auVar134;
            }
            local_5f20 = vandnps_avx(auVar141,local_5f20);
          }
        }
      }
      if ((((((((local_5f20 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_5f20 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_5f20 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_5f20 >> 0x7f,0) == '\0') &&
            (local_5f20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_5f20 >> 0xbf,0) == '\0') &&
          (local_5f20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_5f20[0x1f]) {
        auVar269 = ZEXT3264(CONCAT428(0x7f800000,
                                      CONCAT424(0x7f800000,
                                                CONCAT420(0x7f800000,
                                                          CONCAT416(0x7f800000,
                                                                    CONCAT412(0x7f800000,
                                                                              CONCAT48(0x7f800000,
                                                                                                                                                                              
                                                  0x7f8000007f800000)))))));
        break;
      }
      auVar134 = *(undefined1 (*) [32])ray;
      auVar127 = *(undefined1 (*) [32])(ray + 0x20);
      auVar165 = *(undefined1 (*) [32])(ray + 0x40);
      local_5c60 = vsubps_avx(_local_5ea0,auVar134);
      auVar95._4_4_ = fStack_585c;
      auVar95._0_4_ = local_5860;
      auVar95._8_4_ = fStack_5858;
      auVar95._12_4_ = fStack_5854;
      auVar95._16_4_ = fStack_5850;
      auVar95._20_4_ = fStack_584c;
      auVar95._24_4_ = fStack_5848;
      auVar95._28_4_ = fStack_5844;
      local_5c80 = vsubps_avx(auVar95,auVar127);
      auVar94._4_4_ = fStack_587c;
      auVar94._0_4_ = local_5880;
      auVar94._8_4_ = fStack_5878;
      auVar94._12_4_ = fStack_5874;
      auVar94._16_4_ = fStack_5870;
      auVar94._20_4_ = fStack_586c;
      auVar94._24_4_ = fStack_5868;
      auVar94._28_4_ = fStack_5864;
      local_5ca0 = vsubps_avx(auVar94,auVar165);
      auVar166 = vsubps_avx(local_5d80,auVar134);
      auVar167 = vsubps_avx(local_5da0,auVar127);
      auVar183 = vsubps_avx(local_5dc0,auVar165);
      auVar134 = vsubps_avx(local_5840,auVar134);
      auVar127 = vsubps_avx(local_5de0,auVar127);
      auVar165 = vsubps_avx(local_5e00,auVar165);
      local_5cc0 = vsubps_avx(auVar134,local_5c60);
      local_5ce0 = vsubps_avx(auVar127,local_5c80);
      local_5d00 = vsubps_avx(auVar165,local_5ca0);
      fVar220 = local_5c80._0_4_;
      fVar123 = auVar127._0_4_ + fVar220;
      fVar10 = local_5c80._4_4_;
      fVar224 = auVar127._4_4_ + fVar10;
      fVar12 = local_5c80._8_4_;
      fVar226 = auVar127._8_4_ + fVar12;
      fVar14 = local_5c80._12_4_;
      fVar228 = auVar127._12_4_ + fVar14;
      fVar196 = local_5c80._16_4_;
      fVar247 = auVar127._16_4_ + fVar196;
      fVar118 = local_5c80._20_4_;
      fVar251 = auVar127._20_4_ + fVar118;
      fVar120 = local_5c80._24_4_;
      fVar255 = auVar127._24_4_ + fVar120;
      fVar9 = local_5ca0._0_4_;
      fVar257 = auVar165._0_4_ + fVar9;
      fVar11 = local_5ca0._4_4_;
      fVar202 = auVar165._4_4_ + fVar11;
      fVar13 = local_5ca0._8_4_;
      fVar259 = auVar165._8_4_ + fVar13;
      fVar146 = local_5ca0._12_4_;
      fVar163 = auVar165._12_4_ + fVar146;
      fVar267 = local_5ca0._16_4_;
      fVar170 = auVar165._16_4_ + fVar267;
      fVar119 = local_5ca0._20_4_;
      fVar172 = auVar165._20_4_ + fVar119;
      fVar121 = local_5ca0._24_4_;
      fVar218 = auVar165._24_4_ + fVar121;
      fVar122 = local_5ca0._28_4_;
      fVar231 = auVar165._28_4_;
      fVar117 = local_5d00._0_4_;
      auVar222._0_4_ = fVar123 * fVar117;
      fVar223 = local_5d00._4_4_;
      auVar222._4_4_ = fVar224 * fVar223;
      fVar225 = local_5d00._8_4_;
      auVar222._8_4_ = fVar226 * fVar225;
      fVar227 = local_5d00._12_4_;
      auVar222._12_4_ = fVar228 * fVar227;
      fVar243 = local_5d00._16_4_;
      auVar222._16_4_ = fVar247 * fVar243;
      fVar249 = local_5d00._20_4_;
      auVar222._20_4_ = fVar251 * fVar249;
      fVar253 = local_5d00._24_4_;
      auVar222._28_36_ = auVar262._28_36_;
      auVar222._24_4_ = fVar255 * fVar253;
      fVar270 = local_5ce0._0_4_;
      auVar235._0_4_ = fVar270 * fVar257;
      fVar272 = local_5ce0._4_4_;
      auVar235._4_4_ = fVar272 * fVar202;
      fVar273 = local_5ce0._8_4_;
      auVar235._8_4_ = fVar273 * fVar259;
      fVar274 = local_5ce0._12_4_;
      auVar235._12_4_ = fVar274 * fVar163;
      fVar275 = local_5ce0._16_4_;
      auVar235._16_4_ = fVar275 * fVar170;
      fVar276 = local_5ce0._20_4_;
      auVar235._20_4_ = fVar276 * fVar172;
      fVar277 = local_5ce0._24_4_;
      auVar235._24_4_ = fVar277 * fVar218;
      auVar235._28_36_ = auVar271;
      auVar198 = vsubps_avx(auVar235._0_32_,auVar222._0_32_);
      fVar244 = local_5c60._0_4_;
      fVar173 = fVar244 + auVar134._0_4_;
      fVar248 = local_5c60._4_4_;
      fVar264 = fVar248 + auVar134._4_4_;
      fVar250 = local_5c60._8_4_;
      fVar175 = fVar250 + auVar134._8_4_;
      fVar252 = local_5c60._12_4_;
      fVar265 = fVar252 + auVar134._12_4_;
      fVar254 = local_5c60._16_4_;
      fVar177 = fVar254 + auVar134._16_4_;
      fVar256 = local_5c60._20_4_;
      fVar266 = fVar256 + auVar134._20_4_;
      fVar258 = local_5c60._24_4_;
      fVar179 = fVar258 + auVar134._24_4_;
      fVar214 = local_5c60._28_4_ + auVar134._28_4_;
      fVar287 = local_5cc0._0_4_;
      fVar289 = local_5cc0._4_4_;
      auVar52._4_4_ = fVar289 * fVar202;
      auVar52._0_4_ = fVar287 * fVar257;
      fVar292 = local_5cc0._8_4_;
      auVar52._8_4_ = fVar292 * fVar259;
      fVar294 = local_5cc0._12_4_;
      auVar52._12_4_ = fVar294 * fVar163;
      fVar296 = local_5cc0._16_4_;
      auVar52._16_4_ = fVar296 * fVar170;
      fVar298 = local_5cc0._20_4_;
      auVar52._20_4_ = fVar298 * fVar172;
      fVar300 = local_5cc0._24_4_;
      auVar52._24_4_ = fVar300 * fVar218;
      auVar52._28_4_ = fVar231 + fVar122;
      auVar53._4_4_ = fVar264 * fVar223;
      auVar53._0_4_ = fVar173 * fVar117;
      auVar53._8_4_ = fVar175 * fVar225;
      auVar53._12_4_ = fVar265 * fVar227;
      auVar53._16_4_ = fVar177 * fVar243;
      auVar53._20_4_ = fVar266 * fVar249;
      auVar53._24_4_ = fVar179 * fVar253;
      auVar53._28_4_ = auVar271._0_4_;
      auVar229 = vsubps_avx(auVar53,auVar52);
      auVar54._4_4_ = fVar264 * fVar272;
      auVar54._0_4_ = fVar173 * fVar270;
      auVar54._8_4_ = fVar175 * fVar273;
      auVar54._12_4_ = fVar265 * fVar274;
      auVar54._16_4_ = fVar177 * fVar275;
      auVar54._20_4_ = fVar266 * fVar276;
      auVar54._24_4_ = fVar179 * fVar277;
      auVar54._28_4_ = fVar214;
      auVar55._4_4_ = fVar289 * fVar224;
      auVar55._0_4_ = fVar287 * fVar123;
      auVar55._8_4_ = fVar292 * fVar226;
      auVar55._12_4_ = fVar294 * fVar228;
      auVar55._16_4_ = fVar296 * fVar247;
      auVar55._20_4_ = fVar298 * fVar251;
      auVar55._24_4_ = fVar300 * fVar255;
      auVar55._28_4_ = auVar127._28_4_ + local_5c80._28_4_;
      auVar233 = vsubps_avx(auVar55,auVar54);
      _local_5e80 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar235 = ZEXT3264(_local_5e80);
      fVar232 = local_5e80._0_4_;
      fVar237 = local_5e80._4_4_;
      fVar238 = local_5e80._8_4_;
      fVar239 = local_5e80._12_4_;
      fVar240 = local_5e80._16_4_;
      fVar241 = local_5e80._20_4_;
      fVar242 = local_5e80._24_4_;
      pRVar1 = ray + 0xa0;
      fVar257 = *(float *)pRVar1;
      fVar202 = *(float *)(ray + 0xa4);
      fVar259 = *(float *)(ray + 0xa8);
      fVar163 = *(float *)(ray + 0xac);
      fVar170 = *(float *)(ray + 0xb0);
      fVar172 = *(float *)(ray + 0xb4);
      fVar218 = *(float *)(ray + 0xb8);
      auVar96 = *(undefined1 (*) [28])pRVar1;
      _local_5ea0 = *(undefined1 (*) [32])pRVar1;
      pRVar1 = ray + 0x80;
      fVar173 = *(float *)pRVar1;
      fVar264 = *(float *)(ray + 0x84);
      fVar175 = *(float *)(ray + 0x88);
      fVar265 = *(float *)(ray + 0x8c);
      fVar177 = *(float *)(ray + 0x90);
      fVar266 = *(float *)(ray + 0x94);
      fVar179 = *(float *)(ray + 0x98);
      auVar97 = *(undefined1 (*) [28])pRVar1;
      _local_5d20 = *(undefined1 (*) [32])pRVar1;
      fVar194 = fVar173 * auVar198._0_4_ + fVar232 * auVar233._0_4_ + fVar257 * auVar229._0_4_;
      fVar200 = fVar264 * auVar198._4_4_ + fVar237 * auVar233._4_4_ + fVar202 * auVar229._4_4_;
      fVar204 = fVar175 * auVar198._8_4_ + fVar238 * auVar233._8_4_ + fVar259 * auVar229._8_4_;
      fVar207 = fVar265 * auVar198._12_4_ + fVar239 * auVar233._12_4_ + fVar163 * auVar229._12_4_;
      fVar210 = fVar177 * auVar198._16_4_ + fVar240 * auVar233._16_4_ + fVar170 * auVar229._16_4_;
      fVar213 = fVar266 * auVar198._20_4_ + fVar241 * auVar233._20_4_ + fVar172 * auVar229._20_4_;
      fVar216 = fVar179 * auVar198._24_4_ + fVar242 * auVar233._24_4_ + fVar218 * auVar229._24_4_;
      fStack_5f44 = auVar229._28_4_ + auVar233._28_4_ + auVar229._28_4_;
      local_5f60._4_4_ = fVar200;
      local_5f60._0_4_ = fVar194;
      fStack_5f58 = fVar204;
      fStack_5f54 = fVar207;
      fStack_5f50 = fVar210;
      fStack_5f4c = fVar213;
      fStack_5f48 = fVar216;
      local_5d40 = vsubps_avx(local_5c80,auVar167);
      local_5da0 = vsubps_avx(local_5ca0,auVar183);
      fVar147 = auVar167._0_4_ + fVar220;
      fVar157 = auVar167._4_4_ + fVar10;
      fVar158 = auVar167._8_4_ + fVar12;
      fVar159 = auVar167._12_4_ + fVar14;
      fVar160 = auVar167._16_4_ + fVar196;
      fVar161 = auVar167._20_4_ + fVar118;
      fVar162 = auVar167._24_4_ + fVar120;
      fVar286 = auVar167._28_4_;
      fVar164 = auVar183._0_4_ + fVar9;
      fVar171 = auVar183._4_4_ + fVar11;
      fVar195 = auVar183._8_4_ + fVar13;
      fVar201 = auVar183._12_4_ + fVar146;
      fVar205 = auVar183._16_4_ + fVar267;
      fVar208 = auVar183._20_4_ + fVar119;
      fVar211 = auVar183._24_4_ + fVar121;
      fVar123 = local_5da0._0_4_;
      fVar224 = local_5da0._4_4_;
      auVar56._4_4_ = fVar157 * fVar224;
      auVar56._0_4_ = fVar147 * fVar123;
      fVar226 = local_5da0._8_4_;
      auVar56._8_4_ = fVar158 * fVar226;
      fVar228 = local_5da0._12_4_;
      auVar56._12_4_ = fVar159 * fVar228;
      fVar247 = local_5da0._16_4_;
      auVar56._16_4_ = fVar160 * fVar247;
      fVar251 = local_5da0._20_4_;
      auVar56._20_4_ = fVar161 * fVar251;
      fVar255 = local_5da0._24_4_;
      auVar56._24_4_ = fVar162 * fVar255;
      auVar56._28_4_ = local_5cc0._28_4_;
      fVar197 = local_5d40._0_4_;
      fVar203 = local_5d40._4_4_;
      auVar57._4_4_ = fVar203 * fVar171;
      auVar57._0_4_ = fVar197 * fVar164;
      fVar206 = local_5d40._8_4_;
      auVar57._8_4_ = fVar206 * fVar195;
      fVar209 = local_5d40._12_4_;
      auVar57._12_4_ = fVar209 * fVar201;
      fVar212 = local_5d40._16_4_;
      auVar57._16_4_ = fVar212 * fVar205;
      fVar215 = local_5d40._20_4_;
      auVar57._20_4_ = fVar215 * fVar208;
      fVar219 = local_5d40._24_4_;
      auVar57._24_4_ = fVar219 * fVar211;
      auVar57._28_4_ = fVar122;
      auVar198 = vsubps_avx(auVar57,auVar56);
      local_5d80 = vsubps_avx(local_5c60,auVar166);
      fVar288 = local_5d80._0_4_;
      fVar290 = local_5d80._4_4_;
      auVar58._4_4_ = fVar290 * fVar171;
      auVar58._0_4_ = fVar288 * fVar164;
      fVar293 = local_5d80._8_4_;
      auVar58._8_4_ = fVar293 * fVar195;
      fVar295 = local_5d80._12_4_;
      auVar58._12_4_ = fVar295 * fVar201;
      fVar297 = local_5d80._16_4_;
      auVar58._16_4_ = fVar297 * fVar205;
      fVar299 = local_5d80._20_4_;
      auVar58._20_4_ = fVar299 * fVar208;
      fVar301 = local_5d80._24_4_;
      auVar58._24_4_ = fVar301 * fVar211;
      auVar58._28_4_ = auVar183._28_4_ + fVar122;
      fVar122 = fVar244 + auVar166._0_4_;
      fVar164 = fVar248 + auVar166._4_4_;
      fVar171 = fVar250 + auVar166._8_4_;
      fVar195 = fVar252 + auVar166._12_4_;
      fVar201 = fVar254 + auVar166._16_4_;
      fVar205 = fVar256 + auVar166._20_4_;
      fVar208 = fVar258 + auVar166._24_4_;
      auVar59._4_4_ = fVar164 * fVar224;
      auVar59._0_4_ = fVar122 * fVar123;
      auVar59._8_4_ = fVar171 * fVar226;
      auVar59._12_4_ = fVar195 * fVar228;
      auVar59._16_4_ = fVar201 * fVar247;
      auVar59._20_4_ = fVar205 * fVar251;
      auVar59._24_4_ = fVar208 * fVar255;
      auVar59._28_4_ = fVar214;
      auVar229 = vsubps_avx(auVar59,auVar58);
      auVar261._8_4_ = 0x7fffffff;
      auVar261._0_8_ = 0x7fffffff7fffffff;
      auVar261._12_4_ = 0x7fffffff;
      auVar261._16_4_ = 0x7fffffff;
      auVar261._20_4_ = 0x7fffffff;
      auVar261._24_4_ = 0x7fffffff;
      auVar261._28_4_ = 0x7fffffff;
      auVar262 = ZEXT3264(auVar261);
      auVar60._4_4_ = fVar164 * fVar203;
      auVar60._0_4_ = fVar122 * fVar197;
      auVar60._8_4_ = fVar171 * fVar206;
      auVar60._12_4_ = fVar195 * fVar209;
      auVar60._16_4_ = fVar201 * fVar212;
      auVar60._20_4_ = fVar205 * fVar215;
      auVar60._24_4_ = fVar208 * fVar219;
      auVar60._28_4_ = local_5c60._28_4_ + auVar166._28_4_;
      auVar61._4_4_ = fVar290 * fVar157;
      auVar61._0_4_ = fVar288 * fVar147;
      auVar61._8_4_ = fVar293 * fVar158;
      auVar61._12_4_ = fVar295 * fVar159;
      auVar61._16_4_ = fVar297 * fVar160;
      auVar61._20_4_ = fVar299 * fVar161;
      auVar61._24_4_ = fVar301 * fVar162;
      auVar61._28_4_ = fVar286 + local_5c80._28_4_;
      auVar233 = vsubps_avx(auVar61,auVar60);
      auVar246._0_4_ =
           fVar173 * auVar198._0_4_ + fVar232 * auVar233._0_4_ + fVar257 * auVar229._0_4_;
      auVar246._4_4_ =
           fVar264 * auVar198._4_4_ + fVar237 * auVar233._4_4_ + fVar202 * auVar229._4_4_;
      auVar246._8_4_ =
           fVar175 * auVar198._8_4_ + fVar238 * auVar233._8_4_ + fVar259 * auVar229._8_4_;
      auVar246._12_4_ =
           fVar265 * auVar198._12_4_ + fVar239 * auVar233._12_4_ + fVar163 * auVar229._12_4_;
      auVar246._16_4_ =
           fVar177 * auVar198._16_4_ + fVar240 * auVar233._16_4_ + fVar170 * auVar229._16_4_;
      auVar246._20_4_ =
           fVar266 * auVar198._20_4_ + fVar241 * auVar233._20_4_ + fVar172 * auVar229._20_4_;
      auVar246._24_4_ =
           fVar179 * auVar198._24_4_ + fVar242 * auVar233._24_4_ + fVar218 * auVar229._24_4_;
      auVar246._28_4_ = auVar229._28_4_ + auVar233._28_4_ + auVar229._28_4_;
      auVar198 = vsubps_avx(auVar166,auVar134);
      fVar162 = auVar166._0_4_ + auVar134._0_4_;
      fVar164 = auVar166._4_4_ + auVar134._4_4_;
      fVar171 = auVar166._8_4_ + auVar134._8_4_;
      fVar195 = auVar166._12_4_ + auVar134._12_4_;
      fVar201 = auVar166._16_4_ + auVar134._16_4_;
      fVar205 = auVar166._20_4_ + auVar134._20_4_;
      fVar208 = auVar166._24_4_ + auVar134._24_4_;
      local_5d60 = vsubps_avx(auVar167,auVar127);
      fVar211 = auVar167._0_4_ + auVar127._0_4_;
      fVar214 = auVar167._4_4_ + auVar127._4_4_;
      fVar217 = auVar167._8_4_ + auVar127._8_4_;
      fVar174 = auVar167._12_4_ + auVar127._12_4_;
      fVar176 = auVar167._16_4_ + auVar127._16_4_;
      fVar178 = auVar167._20_4_ + auVar127._20_4_;
      fVar180 = auVar167._24_4_ + auVar127._24_4_;
      fVar181 = fVar286 + auVar127._28_4_;
      auVar127 = vsubps_avx(auVar183,auVar165);
      fVar182 = auVar183._0_4_ + auVar165._0_4_;
      fVar188 = auVar183._4_4_ + auVar165._4_4_;
      fVar189 = auVar183._8_4_ + auVar165._8_4_;
      fVar190 = auVar183._12_4_ + auVar165._12_4_;
      fVar191 = auVar183._16_4_ + auVar165._16_4_;
      fVar192 = auVar183._20_4_ + auVar165._20_4_;
      fVar193 = auVar183._24_4_ + auVar165._24_4_;
      fVar278 = auVar127._0_4_;
      fVar279 = auVar127._4_4_;
      auVar62._4_4_ = fVar279 * fVar214;
      auVar62._0_4_ = fVar278 * fVar211;
      fVar280 = auVar127._8_4_;
      auVar62._8_4_ = fVar280 * fVar217;
      fVar282 = auVar127._12_4_;
      auVar62._12_4_ = fVar282 * fVar174;
      fVar283 = auVar127._16_4_;
      auVar62._16_4_ = fVar283 * fVar176;
      fVar284 = auVar127._20_4_;
      auVar62._20_4_ = fVar284 * fVar178;
      fVar285 = auVar127._24_4_;
      auVar62._24_4_ = fVar285 * fVar180;
      auVar62._28_4_ = fVar286;
      fVar122 = local_5d60._0_4_;
      fVar147 = local_5d60._4_4_;
      auVar63._4_4_ = fVar147 * fVar188;
      auVar63._0_4_ = fVar122 * fVar182;
      fVar157 = local_5d60._8_4_;
      auVar63._8_4_ = fVar157 * fVar189;
      fVar158 = local_5d60._12_4_;
      auVar63._12_4_ = fVar158 * fVar190;
      fVar159 = local_5d60._16_4_;
      auVar63._16_4_ = fVar159 * fVar191;
      fVar160 = local_5d60._20_4_;
      auVar63._20_4_ = fVar160 * fVar192;
      fVar161 = local_5d60._24_4_;
      auVar63._24_4_ = fVar161 * fVar193;
      auVar63._28_4_ = fVar231;
      auVar127 = vsubps_avx(auVar63,auVar62);
      fVar286 = auVar198._0_4_;
      fVar291 = auVar198._4_4_;
      auVar64._4_4_ = fVar291 * fVar188;
      auVar64._0_4_ = fVar286 * fVar182;
      fVar182 = auVar198._8_4_;
      auVar64._8_4_ = fVar182 * fVar189;
      fVar188 = auVar198._12_4_;
      auVar64._12_4_ = fVar188 * fVar190;
      fVar189 = auVar198._16_4_;
      auVar64._16_4_ = fVar189 * fVar191;
      fVar190 = auVar198._20_4_;
      auVar64._20_4_ = fVar190 * fVar192;
      fVar191 = auVar198._24_4_;
      auVar64._24_4_ = fVar191 * fVar193;
      auVar64._28_4_ = auVar183._28_4_ + fVar231;
      auVar65._4_4_ = fVar279 * fVar164;
      auVar65._0_4_ = fVar278 * fVar162;
      auVar65._8_4_ = fVar280 * fVar171;
      auVar65._12_4_ = fVar282 * fVar195;
      auVar65._16_4_ = fVar283 * fVar201;
      auVar65._20_4_ = fVar284 * fVar205;
      auVar65._24_4_ = fVar285 * fVar208;
      auVar65._28_4_ = fVar231;
      auVar165 = vsubps_avx(auVar65,auVar64);
      auVar66._4_4_ = fVar164 * fVar147;
      auVar66._0_4_ = fVar162 * fVar122;
      auVar66._8_4_ = fVar171 * fVar157;
      auVar66._12_4_ = fVar195 * fVar158;
      auVar66._16_4_ = fVar201 * fVar159;
      auVar66._20_4_ = fVar205 * fVar160;
      auVar66._24_4_ = fVar208 * fVar161;
      auVar66._28_4_ = auVar166._28_4_ + auVar134._28_4_;
      auVar67._4_4_ = fVar291 * fVar214;
      auVar67._0_4_ = fVar286 * fVar211;
      auVar67._8_4_ = fVar182 * fVar217;
      auVar67._12_4_ = fVar188 * fVar174;
      auVar67._16_4_ = fVar189 * fVar176;
      auVar67._20_4_ = fVar190 * fVar178;
      auVar67._24_4_ = fVar191 * fVar180;
      auVar67._28_4_ = fVar181;
      auVar134 = vsubps_avx(auVar67,auVar66);
      auVar149._0_4_ =
           fVar173 * auVar127._0_4_ + fVar232 * auVar134._0_4_ + fVar257 * auVar165._0_4_;
      auVar149._4_4_ =
           fVar264 * auVar127._4_4_ + fVar237 * auVar134._4_4_ + fVar202 * auVar165._4_4_;
      auVar149._8_4_ =
           fVar175 * auVar127._8_4_ + fVar238 * auVar134._8_4_ + fVar259 * auVar165._8_4_;
      auVar149._12_4_ =
           fVar265 * auVar127._12_4_ + fVar239 * auVar134._12_4_ + fVar163 * auVar165._12_4_;
      auVar149._16_4_ =
           fVar177 * auVar127._16_4_ + fVar240 * auVar134._16_4_ + fVar170 * auVar165._16_4_;
      auVar149._20_4_ =
           fVar266 * auVar127._20_4_ + fVar241 * auVar134._20_4_ + fVar172 * auVar165._20_4_;
      auVar149._24_4_ =
           fVar179 * auVar127._24_4_ + fVar242 * auVar134._24_4_ + fVar218 * auVar165._24_4_;
      auVar149._28_4_ = fVar181 + auVar134._28_4_ + fVar181;
      auVar109._0_4_ = auVar149._0_4_ + auVar246._0_4_ + fVar194;
      auVar109._4_4_ = auVar149._4_4_ + auVar246._4_4_ + fVar200;
      auVar109._8_4_ = auVar149._8_4_ + auVar246._8_4_ + fVar204;
      auVar109._12_4_ = auVar149._12_4_ + auVar246._12_4_ + fVar207;
      auVar109._16_4_ = auVar149._16_4_ + auVar246._16_4_ + fVar210;
      auVar109._20_4_ = auVar149._20_4_ + auVar246._20_4_ + fVar213;
      auVar109._24_4_ = auVar149._24_4_ + auVar246._24_4_ + fVar216;
      auVar109._28_4_ = auVar149._28_4_ + auVar246._28_4_ + fStack_5f44;
      auVar134 = vminps_avx(_local_5f60,auVar246);
      auVar127 = vminps_avx(auVar134,auVar149);
      auVar134 = vandps_avx(auVar261,auVar109);
      fVar257 = auVar134._0_4_ * 1.1920929e-07;
      fVar202 = auVar134._4_4_ * 1.1920929e-07;
      auVar68._4_4_ = fVar202;
      auVar68._0_4_ = fVar257;
      fVar259 = auVar134._8_4_ * 1.1920929e-07;
      auVar68._8_4_ = fVar259;
      fVar163 = auVar134._12_4_ * 1.1920929e-07;
      auVar68._12_4_ = fVar163;
      fVar170 = auVar134._16_4_ * 1.1920929e-07;
      auVar68._16_4_ = fVar170;
      fVar172 = auVar134._20_4_ * 1.1920929e-07;
      auVar68._20_4_ = fVar172;
      fVar218 = auVar134._24_4_ * 1.1920929e-07;
      auVar68._24_4_ = fVar218;
      auVar68._28_4_ = 0x34000000;
      auVar221._0_8_ = CONCAT44(fVar202,fVar257) ^ 0x8000000080000000;
      auVar221._8_4_ = -fVar259;
      auVar221._12_4_ = -fVar163;
      auVar221._16_4_ = -fVar170;
      auVar221._20_4_ = -fVar172;
      auVar221._24_4_ = -fVar218;
      auVar221._28_4_ = 0xb4000000;
      auVar127 = vcmpps_avx(auVar127,auVar221,5);
      auVar165 = vmaxps_avx(_local_5f60,auVar246);
      auVar165 = vmaxps_avx(auVar165,auVar149);
      auVar165 = vcmpps_avx(auVar165,auVar68,2);
      auVar166 = vorps_avx(auVar127,auVar165);
      auVar222 = ZEXT3264(auVar166);
      auVar167 = local_5f20 & auVar166;
      bVar106 = true;
      if ((((((((auVar167 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar167 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar167 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar167 >> 0x7f,0) == '\0') &&
            (auVar167 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar167 >> 0xbf,0) == '\0') &&
          (auVar167 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar167[0x1f]) {
LAB_00436f59:
        auVar269 = ZEXT3264(CONCAT428(0x7f800000,
                                      CONCAT424(0x7f800000,
                                                CONCAT420(0x7f800000,
                                                          CONCAT416(0x7f800000,
                                                                    CONCAT412(0x7f800000,
                                                                              CONCAT48(0x7f800000,
                                                                                                                                                                              
                                                  0x7f8000007f800000)))))));
      }
      else {
        auVar235 = ZEXT3264(local_5d40);
        auVar69._4_4_ = fVar203 * fVar223;
        auVar69._0_4_ = fVar197 * fVar117;
        auVar69._8_4_ = fVar206 * fVar225;
        auVar69._12_4_ = fVar209 * fVar227;
        auVar69._16_4_ = fVar212 * fVar243;
        auVar69._20_4_ = fVar215 * fVar249;
        auVar69._24_4_ = fVar219 * fVar253;
        auVar69._28_4_ = auVar165._28_4_;
        auVar70._4_4_ = fVar272 * fVar224;
        auVar70._0_4_ = fVar270 * fVar123;
        auVar70._8_4_ = fVar273 * fVar226;
        auVar70._12_4_ = fVar274 * fVar228;
        auVar70._16_4_ = fVar275 * fVar247;
        auVar70._20_4_ = fVar276 * fVar251;
        auVar70._24_4_ = fVar277 * fVar255;
        auVar70._28_4_ = auVar127._28_4_;
        auVar183 = vsubps_avx(auVar70,auVar69);
        auVar71._4_4_ = fVar147 * fVar224;
        auVar71._0_4_ = fVar122 * fVar123;
        auVar71._8_4_ = fVar157 * fVar226;
        auVar71._12_4_ = fVar158 * fVar228;
        auVar71._16_4_ = fVar159 * fVar247;
        auVar71._20_4_ = fVar160 * fVar251;
        auVar71._24_4_ = fVar161 * fVar255;
        auVar71._28_4_ = 0x34000000;
        auVar72._4_4_ = fVar203 * fVar279;
        auVar72._0_4_ = fVar197 * fVar278;
        auVar72._8_4_ = fVar206 * fVar280;
        auVar72._12_4_ = fVar209 * fVar282;
        auVar72._16_4_ = fVar212 * fVar283;
        auVar72._20_4_ = fVar215 * fVar284;
        auVar72._24_4_ = fVar219 * fVar285;
        auVar72._28_4_ = auVar134._28_4_;
        auVar167 = vsubps_avx(auVar72,auVar71);
        auVar127 = vandps_avx(auVar261,auVar69);
        auVar165 = vandps_avx(auVar261,auVar71);
        auVar127 = vcmpps_avx(auVar127,auVar165,1);
        auVar167 = vblendvps_avx(auVar167,auVar183,auVar127);
        auVar73._4_4_ = fVar290 * fVar279;
        auVar73._0_4_ = fVar288 * fVar278;
        auVar73._8_4_ = fVar293 * fVar280;
        auVar73._12_4_ = fVar295 * fVar282;
        auVar73._16_4_ = fVar297 * fVar283;
        auVar73._20_4_ = fVar299 * fVar284;
        auVar73._24_4_ = fVar301 * fVar285;
        auVar73._28_4_ = auVar127._28_4_;
        auVar74._4_4_ = fVar290 * fVar223;
        auVar74._0_4_ = fVar288 * fVar117;
        auVar74._8_4_ = fVar293 * fVar225;
        auVar74._12_4_ = fVar295 * fVar227;
        auVar74._16_4_ = fVar297 * fVar243;
        auVar74._20_4_ = fVar299 * fVar249;
        auVar74._24_4_ = fVar301 * fVar253;
        auVar74._28_4_ = auVar183._28_4_;
        auVar75._4_4_ = fVar289 * fVar224;
        auVar75._0_4_ = fVar287 * fVar123;
        auVar75._8_4_ = fVar292 * fVar226;
        auVar75._12_4_ = fVar294 * fVar228;
        auVar75._16_4_ = fVar296 * fVar247;
        auVar75._20_4_ = fVar298 * fVar251;
        auVar75._24_4_ = fVar300 * fVar255;
        auVar75._28_4_ = auVar165._28_4_;
        auVar198 = vsubps_avx(auVar74,auVar75);
        auVar76._4_4_ = fVar291 * fVar224;
        auVar76._0_4_ = fVar286 * fVar123;
        auVar76._8_4_ = fVar182 * fVar226;
        auVar76._12_4_ = fVar188 * fVar228;
        auVar76._16_4_ = fVar189 * fVar247;
        auVar76._20_4_ = fVar190 * fVar251;
        auVar76._24_4_ = fVar191 * fVar255;
        auVar76._28_4_ = local_5da0._28_4_;
        auVar183 = vsubps_avx(auVar76,auVar73);
        auVar127 = vandps_avx(auVar261,auVar75);
        auVar165 = vandps_avx(auVar261,auVar73);
        auVar127 = vcmpps_avx(auVar127,auVar165,1);
        auVar183 = vblendvps_avx(auVar183,auVar198,auVar127);
        auVar77._4_4_ = fVar291 * fVar203;
        auVar77._0_4_ = fVar286 * fVar197;
        auVar77._8_4_ = fVar182 * fVar206;
        auVar77._12_4_ = fVar188 * fVar209;
        auVar77._16_4_ = fVar189 * fVar212;
        auVar77._20_4_ = fVar190 * fVar215;
        auVar77._24_4_ = fVar191 * fVar219;
        auVar77._28_4_ = local_5d60._28_4_;
        auVar78._4_4_ = fVar203 * fVar289;
        auVar78._0_4_ = fVar197 * fVar287;
        auVar78._8_4_ = fVar206 * fVar292;
        auVar78._12_4_ = fVar209 * fVar294;
        auVar78._16_4_ = fVar212 * fVar296;
        auVar78._20_4_ = fVar215 * fVar298;
        auVar78._24_4_ = fVar219 * fVar300;
        auVar78._28_4_ = auVar127._28_4_;
        auVar79._4_4_ = fVar290 * fVar272;
        auVar79._0_4_ = fVar288 * fVar270;
        auVar79._8_4_ = fVar293 * fVar273;
        auVar79._12_4_ = fVar295 * fVar274;
        auVar79._16_4_ = fVar297 * fVar275;
        auVar79._20_4_ = fVar299 * fVar276;
        auVar79._24_4_ = fVar301 * fVar277;
        auVar79._28_4_ = auVar198._28_4_;
        auVar80._4_4_ = fVar290 * fVar147;
        auVar80._0_4_ = fVar288 * fVar122;
        auVar80._8_4_ = fVar293 * fVar157;
        auVar80._12_4_ = fVar295 * fVar158;
        auVar80._16_4_ = fVar297 * fVar159;
        auVar80._20_4_ = fVar299 * fVar160;
        auVar80._24_4_ = fVar301 * fVar161;
        auVar80._28_4_ = local_5ce0._28_4_;
        auVar229 = vsubps_avx(auVar78,auVar79);
        auVar233 = vsubps_avx(auVar80,auVar77);
        auVar127 = vandps_avx(auVar261,auVar79);
        auVar165 = vandps_avx(auVar261,auVar77);
        auVar198 = vcmpps_avx(auVar127,auVar165,1);
        auVar165 = vblendvps_avx(auVar233,auVar229,auVar198);
        local_5ea0._0_4_ = auVar96._0_4_;
        local_5ea0._4_4_ = auVar96._4_4_;
        fStack_5e98 = auVar96._8_4_;
        fStack_5e94 = auVar96._12_4_;
        fStack_5e90 = auVar96._16_4_;
        fStack_5e8c = auVar96._20_4_;
        fStack_5e88 = auVar96._24_4_;
        local_5d20._0_4_ = auVar97._0_4_;
        local_5d20._4_4_ = auVar97._4_4_;
        fStack_5d18 = auVar97._8_4_;
        fStack_5d14 = auVar97._12_4_;
        fStack_5d10 = auVar97._16_4_;
        fStack_5d0c = auVar97._20_4_;
        fStack_5d08 = auVar97._24_4_;
        fVar122 = auVar167._0_4_ * (float)local_5d20._0_4_ +
                  auVar165._0_4_ * fVar232 + auVar183._0_4_ * (float)local_5ea0._0_4_;
        fVar117 = auVar167._4_4_ * (float)local_5d20._4_4_ +
                  auVar165._4_4_ * fVar237 + auVar183._4_4_ * (float)local_5ea0._4_4_;
        fVar123 = auVar167._8_4_ * fStack_5d18 +
                  auVar165._8_4_ * fVar238 + auVar183._8_4_ * fStack_5e98;
        fVar223 = auVar167._12_4_ * fStack_5d14 +
                  auVar165._12_4_ * fVar239 + auVar183._12_4_ * fStack_5e94;
        fVar224 = auVar167._16_4_ * fStack_5d10 +
                  auVar165._16_4_ * fVar240 + auVar183._16_4_ * fStack_5e90;
        fVar225 = auVar167._20_4_ * fStack_5d0c +
                  auVar165._20_4_ * fVar241 + auVar183._20_4_ * fStack_5e8c;
        fVar226 = auVar167._24_4_ * fStack_5d08 +
                  auVar165._24_4_ * fVar242 + auVar183._24_4_ * fStack_5e88;
        fVar227 = auVar198._28_4_ + auVar233._28_4_ + auVar198._28_4_;
        auVar110._0_4_ = fVar122 + fVar122;
        auVar110._4_4_ = fVar117 + fVar117;
        auVar110._8_4_ = fVar123 + fVar123;
        auVar110._12_4_ = fVar223 + fVar223;
        auVar110._16_4_ = fVar224 + fVar224;
        auVar110._20_4_ = fVar225 + fVar225;
        auVar110._24_4_ = fVar226 + fVar226;
        auVar110._28_4_ = fVar227 + fVar227;
        fVar122 = auVar167._0_4_ * fVar244 + auVar165._0_4_ * fVar9 + auVar183._0_4_ * fVar220;
        fVar117 = auVar167._4_4_ * fVar248 + auVar165._4_4_ * fVar11 + auVar183._4_4_ * fVar10;
        fVar123 = auVar167._8_4_ * fVar250 + auVar165._8_4_ * fVar13 + auVar183._8_4_ * fVar12;
        fVar146 = auVar167._12_4_ * fVar252 + auVar165._12_4_ * fVar146 + auVar183._12_4_ * fVar14;
        fVar196 = auVar167._16_4_ * fVar254 + auVar165._16_4_ * fVar267 + auVar183._16_4_ * fVar196;
        fVar267 = auVar167._20_4_ * fVar256 + auVar165._20_4_ * fVar119 + auVar183._20_4_ * fVar118;
        fVar118 = auVar167._24_4_ * fVar258 + auVar165._24_4_ * fVar121 + auVar183._24_4_ * fVar120;
        auVar198 = vrcpps_avx(auVar110);
        fVar220 = auVar198._0_4_;
        fVar9 = auVar198._4_4_;
        auVar81._4_4_ = auVar110._4_4_ * fVar9;
        auVar81._0_4_ = auVar110._0_4_ * fVar220;
        fVar10 = auVar198._8_4_;
        auVar81._8_4_ = auVar110._8_4_ * fVar10;
        fVar11 = auVar198._12_4_;
        auVar81._12_4_ = auVar110._12_4_ * fVar11;
        fVar12 = auVar198._16_4_;
        auVar81._16_4_ = auVar110._16_4_ * fVar12;
        fVar13 = auVar198._20_4_;
        auVar81._20_4_ = auVar110._20_4_ * fVar13;
        fVar14 = auVar198._24_4_;
        auVar81._24_4_ = auVar110._24_4_ * fVar14;
        auVar81._28_4_ = auVar127._28_4_;
        auVar186._8_4_ = 0x3f800000;
        auVar186._0_8_ = 0x3f8000003f800000;
        auVar186._12_4_ = 0x3f800000;
        auVar186._16_4_ = 0x3f800000;
        auVar186._20_4_ = 0x3f800000;
        auVar186._24_4_ = 0x3f800000;
        auVar186._28_4_ = 0x3f800000;
        auVar127 = vsubps_avx(auVar186,auVar81);
        auVar82._4_4_ = (fVar117 + fVar117) * (fVar9 + fVar9 * auVar127._4_4_);
        auVar82._0_4_ = (fVar122 + fVar122) * (fVar220 + fVar220 * auVar127._0_4_);
        auVar82._8_4_ = (fVar123 + fVar123) * (fVar10 + fVar10 * auVar127._8_4_);
        auVar82._12_4_ = (fVar146 + fVar146) * (fVar11 + fVar11 * auVar127._12_4_);
        auVar82._16_4_ = (fVar196 + fVar196) * (fVar12 + fVar12 * auVar127._16_4_);
        auVar82._20_4_ = (fVar267 + fVar267) * (fVar13 + fVar13 * auVar127._20_4_);
        auVar82._24_4_ = (fVar118 + fVar118) * (fVar14 + fVar14 * auVar127._24_4_);
        auVar82._28_4_ = auVar127._28_4_;
        _local_5f60 = *(undefined1 (*) [32])(ray + 0x100);
        auVar262 = ZEXT3264(_local_5f60);
        auVar127 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar82,2);
        auVar198 = vcmpps_avx(auVar82,_local_5f60,2);
        auVar127 = vandps_avx(auVar127,auVar198);
        auVar198 = vcmpps_avx(auVar110,_DAT_01faff00,4);
        auVar127 = vandps_avx(auVar198,auVar127);
        auVar125 = vpslld_avx(auVar127._0_16_,0x1f);
        auVar126 = vpsrad_avx(auVar125,0x1f);
        auVar125 = vpslld_avx(auVar127._16_16_,0x1f);
        auVar125 = vpsrad_avx(auVar125,0x1f);
        auVar111._16_16_ = auVar125;
        auVar111._0_16_ = auVar126;
        auVar127 = vandps_avx(auVar166,local_5f20);
        auVar166 = auVar127 & auVar111;
        local_5e00 = auVar134;
        local_5de0 = auVar246;
        local_5dc0 = auVar109;
        if ((((((((auVar166 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar166 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar166 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar166 >> 0x7f,0) == '\0') &&
              (auVar166 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar166 >> 0xbf,0) == '\0') &&
            (auVar166 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar166[0x1f]) goto LAB_00436f59;
        auVar127 = vandps_avx(auVar111,auVar127);
        uVar4 = *(uint *)(lVar99 + -0x10 + uVar105 * 4);
        pGVar6 = (context->scene->geometries).items[uVar4].ptr;
        uVar3 = pGVar6->mask;
        auVar139._4_4_ = uVar3;
        auVar139._0_4_ = uVar3;
        auVar139._8_4_ = uVar3;
        auVar139._12_4_ = uVar3;
        auVar139._16_4_ = uVar3;
        auVar139._20_4_ = uVar3;
        auVar139._24_4_ = uVar3;
        auVar139._28_4_ = uVar3;
        auVar166 = vandps_avx(auVar139,*(undefined1 (*) [32])(ray + 0x120));
        auVar125 = vpcmpeqd_avx(auVar166._16_16_,ZEXT816(0) << 0x20);
        auVar126 = vpcmpeqd_avx(auVar166._0_16_,ZEXT816(0) << 0x20);
        auVar150._16_16_ = auVar125;
        auVar150._0_16_ = auVar127._0_16_;
        auVar166 = vblendps_avx(ZEXT1632(auVar126),auVar150,0xf0);
        auVar198 = auVar127 & ~auVar166;
        auVar269 = ZEXT3264(CONCAT428(0x7f800000,
                                      CONCAT424(0x7f800000,
                                                CONCAT420(0x7f800000,
                                                          CONCAT416(0x7f800000,
                                                                    CONCAT412(0x7f800000,
                                                                              CONCAT48(0x7f800000,
                                                                                                                                                                              
                                                  0x7f8000007f800000)))))));
        if ((((((((auVar198 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar198 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar198 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar198 >> 0x7f,0) != '\0') ||
              (auVar198 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar198 >> 0xbf,0) != '\0') ||
            (auVar198 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar198[0x1f] < '\0') {
          auVar152 = vandnps_avx(auVar166,auVar127);
          auVar125 = auVar152._0_16_;
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            auVar127 = vrcpps_avx(auVar109);
            fVar220 = auVar127._0_4_;
            fVar9 = auVar127._4_4_;
            auVar86._4_4_ = auVar109._4_4_ * fVar9;
            auVar86._0_4_ = auVar109._0_4_ * fVar220;
            fVar10 = auVar127._8_4_;
            auVar86._8_4_ = auVar109._8_4_ * fVar10;
            fVar11 = auVar127._12_4_;
            auVar86._12_4_ = auVar109._12_4_ * fVar11;
            fVar12 = auVar127._16_4_;
            auVar86._16_4_ = auVar109._16_4_ * fVar12;
            fVar13 = auVar127._20_4_;
            auVar86._20_4_ = auVar109._20_4_ * fVar13;
            fVar14 = auVar127._24_4_;
            auVar86._24_4_ = auVar109._24_4_ * fVar14;
            auVar86._28_4_ = auVar166._28_4_;
            auVar199._8_4_ = 0x3f800000;
            auVar199._0_8_ = 0x3f8000003f800000;
            auVar199._12_4_ = 0x3f800000;
            auVar199._16_4_ = 0x3f800000;
            auVar199._20_4_ = 0x3f800000;
            auVar199._24_4_ = 0x3f800000;
            auVar199._28_4_ = 0x3f800000;
            auVar166 = vsubps_avx(auVar199,auVar86);
            auVar113._0_4_ = fVar220 + fVar220 * auVar166._0_4_;
            auVar113._4_4_ = fVar9 + fVar9 * auVar166._4_4_;
            auVar113._8_4_ = fVar10 + fVar10 * auVar166._8_4_;
            auVar113._12_4_ = fVar11 + fVar11 * auVar166._12_4_;
            auVar113._16_4_ = fVar12 + fVar12 * auVar166._16_4_;
            auVar113._20_4_ = fVar13 + fVar13 * auVar166._20_4_;
            auVar113._24_4_ = fVar14 + fVar14 * auVar166._24_4_;
            auVar113._28_4_ = auVar127._28_4_ + auVar166._28_4_;
            auVar140._8_4_ = 0x219392ef;
            auVar140._0_8_ = 0x219392ef219392ef;
            auVar140._12_4_ = 0x219392ef;
            auVar140._16_4_ = 0x219392ef;
            auVar140._20_4_ = 0x219392ef;
            auVar140._24_4_ = 0x219392ef;
            auVar140._28_4_ = 0x219392ef;
            auVar127 = vcmpps_avx(auVar134,auVar140,5);
            auVar134 = vandps_avx(auVar127,auVar113);
            auVar87._4_4_ = auVar134._4_4_ * fVar200;
            auVar87._0_4_ = auVar134._0_4_ * fVar194;
            auVar87._8_4_ = auVar134._8_4_ * fVar204;
            auVar87._12_4_ = auVar134._12_4_ * fVar207;
            auVar87._16_4_ = auVar134._16_4_ * fVar210;
            auVar87._20_4_ = auVar134._20_4_ * fVar213;
            auVar87._24_4_ = auVar134._24_4_ * fVar216;
            auVar87._28_4_ = auVar127._28_4_;
            auVar127 = vminps_avx(auVar87,auVar199);
            auVar88._4_4_ = auVar134._4_4_ * auVar246._4_4_;
            auVar88._0_4_ = auVar134._0_4_ * auVar246._0_4_;
            auVar88._8_4_ = auVar134._8_4_ * auVar246._8_4_;
            auVar88._12_4_ = auVar134._12_4_ * auVar246._12_4_;
            auVar88._16_4_ = auVar134._16_4_ * auVar246._16_4_;
            auVar88._20_4_ = auVar134._20_4_ * auVar246._20_4_;
            auVar88._24_4_ = auVar134._24_4_ * auVar246._24_4_;
            auVar88._28_4_ = auVar134._28_4_;
            auVar134 = vminps_avx(auVar88,auVar199);
            auVar166 = vsubps_avx(auVar199,auVar127);
            auVar198 = vsubps_avx(auVar199,auVar134);
            auVar126._8_8_ = uStack_5938;
            auVar126._0_8_ = local_5940;
            auVar92._16_8_ = uStack_5930;
            auVar92._0_16_ = auVar126;
            auVar92._24_8_ = uStack_5928;
            auVar222 = ZEXT3264(auVar92);
            local_5be0 = vblendvps_avx(auVar127,auVar166,auVar92);
            local_5bc0 = vblendvps_avx(auVar134,auVar198,auVar92);
            pRVar7 = context->user;
            local_5b80 = vpshufd_avx(ZEXT416(uVar4),0);
            local_5ba0 = vpshufd_avx(ZEXT416(*(uint *)(lVar99 + uVar105 * 4)),0);
            auVar134 = vcmpps_avx(local_5bc0,local_5bc0,0xf);
            local_5ed8[1] = auVar134;
            *local_5ed8 = auVar134;
            local_5b60 = pRVar7->instID[0];
            local_5b40 = pRVar7->instPrimID[0];
            auVar134 = vblendvps_avx(_local_5f60,auVar82,auVar152);
            *(undefined1 (*) [32])(ray + 0x100) = auVar134;
            local_5ed0.valid = (int *)local_5f00;
            local_5ed0.geometryUserPtr = pGVar6->userPtr;
            local_5ed0.context = context->user;
            local_5ed0.hit = local_5c40;
            local_5ed0.N = 8;
            local_5c40 = (RTCHitN  [32])auVar167;
            local_5c20 = auVar183;
            local_5c00 = auVar165;
            local_5b90 = local_5ba0;
            local_5b70 = local_5b80;
            uStack_5b5c = local_5b60;
            uStack_5b58 = local_5b60;
            uStack_5b54 = local_5b60;
            uStack_5b50 = local_5b60;
            uStack_5b4c = local_5b60;
            uStack_5b48 = local_5b60;
            uStack_5b44 = local_5b60;
            uStack_5b3c = local_5b40;
            uStack_5b38 = local_5b40;
            uStack_5b34 = local_5b40;
            uStack_5b30 = local_5b40;
            uStack_5b2c = local_5b40;
            uStack_5b28 = local_5b40;
            uStack_5b24 = local_5b40;
            if (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0) {
              local_5f00._16_16_ = auVar152._16_16_;
              local_5ed0.ray = (RTCRayN *)ray;
            }
            else {
              auVar222 = ZEXT1664(auVar126);
              auVar235 = ZEXT1664(local_5d40._0_16_);
              auVar262 = ZEXT1664(local_5f60._0_16_);
              local_5f00._0_32_ = auVar152;
              local_5ed0.ray = (RTCRayN *)ray;
              (*pGVar6->occlusionFilterN)(&local_5ed0);
              auVar269 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              uVar102 = local_5f70;
              context = local_5f68;
              auVar125 = local_5f00._0_16_;
              auVar152 = local_5f00._0_32_;
            }
            local_5f00._0_32_ = auVar152;
            auVar126 = vpcmpeqd_avx(auVar125,ZEXT816(0) << 0x40);
            auVar124 = vpcmpeqd_avx(local_5f00._16_16_,ZEXT816(0) << 0x40);
            auVar142._16_16_ = auVar124;
            auVar142._0_16_ = auVar126;
            auVar134 = vcmpps_avx(ZEXT1632(auVar124),ZEXT1632(auVar124),0xf);
            auVar127 = auVar134 & ~auVar142;
            if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar127 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar127 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar127 >> 0x7f,0) == '\0') &&
                  (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar127 >> 0xbf,0) == '\0') &&
                (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar127[0x1f]) {
              auVar152._0_4_ = auVar126._0_4_ ^ auVar134._0_4_;
              auVar152._4_4_ = auVar126._4_4_ ^ auVar134._4_4_;
              auVar152._8_4_ = auVar126._8_4_ ^ auVar134._8_4_;
              auVar152._12_4_ = auVar126._12_4_ ^ auVar134._12_4_;
              auVar152._16_4_ = auVar124._0_4_ ^ auVar134._16_4_;
              auVar152._20_4_ = auVar124._4_4_ ^ auVar134._20_4_;
              auVar152._24_4_ = auVar124._8_4_ ^ auVar134._24_4_;
              auVar152._28_4_ = auVar124._12_4_ ^ auVar134._28_4_;
            }
            else {
              p_Var8 = context->args->filter;
              auVar126 = local_5f00._16_16_;
              if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                auVar222 = ZEXT1664(auVar222._0_16_);
                auVar235 = ZEXT1664(auVar235._0_16_);
                auVar262 = ZEXT1664(auVar262._0_16_);
                (*p_Var8)(&local_5ed0);
                auVar269 = ZEXT3264(CONCAT428(0x7f800000,
                                              CONCAT424(0x7f800000,
                                                        CONCAT420(0x7f800000,
                                                                  CONCAT416(0x7f800000,
                                                                            CONCAT412(0x7f800000,
                                                                                      CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                uVar102 = local_5f70;
                context = local_5f68;
                auVar126 = local_5f00._16_16_;
                auVar125 = local_5f00._0_16_;
              }
              auVar125 = vpcmpeqd_avx(auVar125,ZEXT816(0) << 0x40);
              auVar126 = vpcmpeqd_avx(auVar126,ZEXT816(0) << 0x40);
              auVar115._16_16_ = auVar126;
              auVar115._0_16_ = auVar125;
              auVar152._0_8_ = auVar125._0_8_ ^ 0xffffffffffffffff;
              auVar152._8_4_ = auVar125._8_4_ ^ 0xffffffff;
              auVar152._12_4_ = auVar125._12_4_ ^ 0xffffffff;
              auVar152._16_4_ = auVar126._0_4_ ^ 0xffffffff;
              auVar152._20_4_ = auVar126._4_4_ ^ 0xffffffff;
              auVar152._24_4_ = auVar126._8_4_ ^ 0xffffffff;
              auVar152._28_4_ = auVar126._12_4_ ^ 0xffffffff;
              auVar143._8_4_ = 0xff800000;
              auVar143._0_8_ = 0xff800000ff800000;
              auVar143._12_4_ = 0xff800000;
              auVar143._16_4_ = 0xff800000;
              auVar143._20_4_ = 0xff800000;
              auVar143._24_4_ = 0xff800000;
              auVar143._28_4_ = 0xff800000;
              auVar134 = vblendvps_avx(auVar143,*(undefined1 (*) [32])(local_5ed0.ray + 0x100),
                                       auVar115);
              *(undefined1 (*) [32])(local_5ed0.ray + 0x100) = auVar134;
            }
            auVar134 = vblendvps_avx(_local_5f60,*(undefined1 (*) [32])local_5f28,auVar152);
            *(undefined1 (*) [32])local_5f28 = auVar134;
          }
          auVar134 = local_5f20 & ~auVar152;
          local_5f20 = vandnps_avx(auVar152,local_5f20);
          bVar106 = (((((((auVar134 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar134 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar134 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar134 >> 0x7f,0) != '\0') ||
                      (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar134 >> 0xbf,0) != '\0') ||
                    (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar134[0x1f] < '\0';
        }
      }
      if ((!bVar106) ||
         (unaff_R15 = uVar105 + 1, bVar106 = 2 < uVar105, uVar105 = unaff_R15, bVar106)) break;
    }
    auVar125 = local_5f20._0_16_;
    auVar135 = vandps_avx(local_5f20,local_5e20);
    auVar134 = local_5e20 & local_5f20;
    if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar134 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar134 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar134 >> 0x7f,0) == '\0') &&
          (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar134 >> 0xbf,0) == '\0') &&
        (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar134[0x1f])
    break;
  }
  auVar116._0_8_ = auVar135._0_8_ ^ 0xffffffffffffffff;
  auVar116._8_4_ = auVar135._8_4_ ^ 0xffffffff;
  auVar116._12_4_ = auVar135._12_4_ ^ 0xffffffff;
  auVar116._16_4_ = auVar135._16_4_ ^ 0xffffffff;
  auVar116._20_4_ = auVar135._20_4_ ^ 0xffffffff;
  auVar116._24_4_ = auVar135._24_4_ ^ 0xffffffff;
  auVar116._28_4_ = auVar135._28_4_ ^ 0xffffffff;
LAB_0043740e:
  _local_5e60 = vorps_avx(_local_5e60,auVar116);
  auVar125 = vpcmpeqd_avx(auVar125,auVar125);
  auVar126 = vpcmpgtd_avx(local_5e60._16_16_,auVar125);
  auVar125 = vpcmpgtd_avx(local_5e60._0_16_,auVar125);
  auVar125 = vpor_avx(auVar125,auVar126);
  if ((((auVar125 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar125 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar125 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar125[0xf])
  goto LAB_00437561;
  auVar154._8_4_ = 0xff800000;
  auVar154._0_8_ = 0xff800000ff800000;
  auVar154._12_4_ = 0xff800000;
  auVar154._16_4_ = 0xff800000;
  auVar154._20_4_ = 0xff800000;
  auVar154._24_4_ = 0xff800000;
  auVar154._28_4_ = 0xff800000;
  auVar156 = ZEXT3264(auVar154);
  local_5980 = vblendvps_avx(local_5980,auVar154,_local_5e60);
  goto LAB_00436087;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }